

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_ebgodunov_plm.cpp
# Opt level: O2

void EBPLM::PredictVelOnYFace
               (Box *yebox,Array4<double> *Imy,Array4<double> *Ipy,Array4<const_double> *q,
               Array4<const_double> *ccvel,Array4<const_amrex::EBCellFlag> *flag,
               Array4<const_double> *vfrac,Array4<const_double> *fcx,Array4<const_double> *fcy,
               Array4<const_double> *fcz,Array4<const_double> *ccc,Geometry *geom,Real dt,
               Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *h_bcrec,BCRec *pbc)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  uint uVar17;
  uint uVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  uint uVar29;
  BCRec *bcrec;
  long lVar30;
  long lVar31;
  double *pdVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  double *pdVar37;
  long lVar38;
  long lVar39;
  double *pdVar40;
  long lVar41;
  long lVar42;
  long lVar43;
  double *pdVar44;
  long lVar45;
  long lVar46;
  long lVar47;
  EBCellFlag *pEVar48;
  long lVar49;
  long lVar50;
  double *pdVar51;
  long lVar52;
  long lVar53;
  double *pdVar54;
  long lVar55;
  double *pdVar56;
  long lVar57;
  long lVar58;
  long lVar59;
  double *pdVar60;
  long lVar61;
  long lVar62;
  long lVar63;
  double *pdVar64;
  long lVar65;
  long lVar66;
  long lVar67;
  undefined8 uVar68;
  undefined4 uVar69;
  undefined4 uVar70;
  undefined4 uVar71;
  undefined4 uVar72;
  undefined4 uVar73;
  undefined4 uVar74;
  undefined4 uVar75;
  undefined4 uVar76;
  undefined4 uVar77;
  undefined4 uVar78;
  undefined4 uVar79;
  int iVar80;
  int iVar81;
  bool bVar82;
  pair<bool,_bool> pVar83;
  pair<bool,_bool> pVar84;
  pair<bool,_bool> pVar85;
  int iVar86;
  int iVar87;
  int iVar88;
  int iVar89;
  long lVar90;
  long lVar91;
  long lVar92;
  long lVar93;
  int iVar94;
  long lVar95;
  long lVar96;
  long lVar97;
  long lVar98;
  long lVar99;
  long lVar100;
  long lVar101;
  long lVar102;
  long lVar103;
  long lVar104;
  long lVar105;
  long lVar106;
  long lVar107;
  long lVar108;
  long lVar109;
  double *pdVar110;
  Real *pRVar111;
  int dir;
  int dir_00;
  int iVar112;
  long lVar113;
  long lVar114;
  long lVar115;
  long lVar116;
  long lVar117;
  long lVar118;
  long lVar119;
  long lVar120;
  long lVar121;
  long lVar122;
  long lVar123;
  long lVar124;
  char cVar125;
  int iVar126;
  int iVar127;
  long lVar128;
  long lVar129;
  char cVar130;
  uint uVar131;
  int iVar132;
  int iVar133;
  long lVar134;
  long lVar135;
  long lVar136;
  long lVar137;
  long lVar138;
  double *pdVar139;
  long lVar140;
  long lVar141;
  long lVar142;
  long lVar143;
  long lVar144;
  long lVar145;
  long lVar146;
  long lVar147;
  long lVar148;
  long lVar149;
  long lVar150;
  double *pdVar151;
  Real (*paRVar152) [3];
  long lVar153;
  long lVar154;
  int kk_1;
  int iVar155;
  int iVar156;
  long lVar157;
  long lVar158;
  double *pdVar159;
  long lVar160;
  int iVar161;
  int iVar162;
  int iVar163;
  long lVar164;
  long lVar165;
  long lVar166;
  long lVar167;
  long lVar168;
  double *pdVar169;
  double *pdVar170;
  int iVar171;
  int iVar172;
  double *pdVar173;
  double *pdVar174;
  double *pdVar175;
  long lVar176;
  long lVar177;
  int k;
  int iVar178;
  int iVar179;
  long lVar180;
  long lVar181;
  long lVar182;
  long lVar183;
  long lVar184;
  int kk;
  int iVar185;
  int iVar186;
  long lVar187;
  ulong uVar188;
  double dVar189;
  Real RVar190;
  double dVar191;
  double dVar192;
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  Real qj;
  double dVar195;
  ulong uVar196;
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  double dVar199;
  double dVar200;
  double dVar201;
  double dVar202;
  Real delta_z;
  double dVar203;
  double dVar204;
  double dVar205;
  double dVar206;
  double dVar207;
  Real delta_x;
  double dVar208;
  double dVar209;
  double dVar210;
  double dVar211;
  double dVar212;
  double dVar213;
  double dVar214;
  double dVar215;
  double *local_9d8;
  double local_9c8;
  double local_9c0;
  double local_9b8;
  long local_8b8;
  double *local_878;
  double *local_870;
  double *local_868;
  double local_6e8 [92];
  double local_408;
  double local_400;
  double local_3f8;
  double local_3e8;
  double dStack_3e0;
  double local_3c8;
  Real du [27];
  Real A [27] [3];
  
  dVar189 = dt / (geom->super_CoordSys).dx[1];
  iVar179 = (geom->domain).smallend.vect[0];
  iVar186 = (geom->domain).smallend.vect[1];
  bcrec = (h_bcrec->super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>).
          super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
          super__Vector_impl_data._M_start;
  iVar172 = (geom->domain).bigend.vect[0];
  iVar5 = (geom->domain).bigend.vect[1];
  pVar83 = anon_unknown.dwarf_582639::has_extdir_or_ho(bcrec,0,(int)Ipy);
  pVar84 = anon_unknown.dwarf_582639::has_extdir_or_ho(bcrec,1,dir);
  iVar6 = (geom->domain).smallend.vect[2];
  iVar7 = (geom->domain).bigend.vect[2];
  pVar85 = anon_unknown.dwarf_582639::has_extdir_or_ho(bcrec,2,dir_00);
  if ((((ushort)pVar83 & 1) == 0) || (iVar179 < (yebox->smallend).vect[0] + -1)) {
    iVar8 = (yebox->bigend).vect[0];
    if ((((iVar8 < iVar172 || ((ushort)pVar83 >> 8 & 1) == 0) &&
         ((((ushort)pVar85 & 1) == 0 || (iVar6 < (yebox->smallend).vect[2] + -1)))) &&
        ((((ushort)pVar85 >> 8 & 1) == 0 || ((yebox->bigend).vect[2] < iVar7)))) &&
       (((((ushort)pVar84 & 1) == 0 || (iVar186 < (yebox->smallend).vect[1] + -1)) &&
        ((((ushort)pVar84 >> 8 & 1) == 0 || ((yebox->bigend).vect[1] < iVar5)))))) {
      lVar30 = ccc->kstride;
      iVar179 = (ccc->begin).z;
      lVar95 = (long)(yebox->smallend).vect[2];
      lVar90 = (~(long)iVar179 + lVar95) * lVar30;
      iVar186 = (yebox->smallend).vect[0];
      lVar153 = (long)iVar186;
      lVar31 = ccc->nstride;
      uVar9 = (ccc->begin).x;
      lVar157 = (long)(int)uVar9;
      pdVar32 = q->p;
      lVar33 = q->jstride;
      lVar34 = q->kstride;
      lVar35 = q->nstride;
      uVar10 = (q->begin).x;
      lVar134 = (long)(int)uVar10;
      iVar172 = (q->begin).y;
      lVar164 = (long)iVar172;
      iVar5 = (q->begin).z;
      lVar165 = (long)iVar5;
      lVar36 = ccvel->nstride;
      pdVar37 = ccvel->p;
      lVar38 = ccvel->jstride;
      lVar39 = ccvel->kstride;
      lVar166 = (long)(ccvel->begin).x;
      lVar167 = (long)(ccvel->begin).y;
      iVar6 = (ccvel->begin).z;
      pdVar40 = Imy->p;
      lVar41 = Imy->jstride;
      lVar42 = Imy->kstride;
      lVar43 = Imy->nstride;
      iVar7 = (Imy->begin).x;
      iVar8 = (Imy->begin).y;
      iVar11 = (Imy->begin).z;
      pdVar44 = Ipy->p;
      lVar45 = Ipy->jstride;
      lVar46 = Ipy->kstride;
      lVar47 = Ipy->nstride;
      iVar12 = (Ipy->begin).x;
      uVar13 = (Ipy->begin).y;
      iVar14 = (Ipy->begin).z;
      pEVar48 = flag->p;
      lVar49 = flag->jstride;
      lVar50 = flag->kstride;
      iVar15 = (flag->begin).x;
      lVar123 = (long)(flag->begin).y;
      iVar16 = (flag->begin).z;
      pdVar51 = vfrac->p;
      lVar52 = vfrac->jstride;
      lVar53 = vfrac->kstride;
      uVar17 = (vfrac->begin).x;
      lVar124 = (long)(int)uVar17;
      iVar127 = (vfrac->begin).y;
      lVar180 = (long)iVar127;
      uVar18 = (vfrac->begin).z;
      lVar91 = (long)(int)uVar18;
      pdVar54 = ccc->p;
      lVar55 = ccc->jstride;
      iVar19 = (ccc->begin).y;
      pdVar56 = fcx->p;
      lVar57 = fcx->jstride;
      lVar58 = fcx->kstride;
      lVar59 = fcx->nstride;
      iVar20 = (fcx->begin).x;
      lVar181 = (long)(fcx->begin).y;
      iVar21 = (fcx->begin).z;
      pdVar60 = fcy->p;
      lVar61 = fcy->jstride;
      lVar62 = fcy->kstride;
      lVar63 = fcy->nstride;
      lVar182 = (long)(fcy->begin).x;
      iVar22 = (fcy->begin).y;
      iVar23 = (fcy->begin).z;
      pdVar64 = fcz->p;
      lVar65 = fcz->jstride;
      lVar66 = fcz->kstride;
      lVar67 = fcz->nstride;
      lVar183 = (long)(fcz->begin).x;
      lVar184 = (long)(fcz->begin).y;
      iVar24 = (fcz->begin).z;
      iVar25 = (yebox->smallend).vect[1];
      iVar26 = (yebox->bigend).vect[0];
      iVar27 = (yebox->bigend).vect[1];
      iVar28 = (yebox->bigend).vect[2];
      uVar131 = ~uVar10;
      lVar122 = 0;
      do {
        if (lVar122 == 3) {
          return;
        }
        lVar96 = lVar122 * lVar35;
        lVar92 = lVar95;
        local_878 = pdVar54 + ((lVar31 * 2 + lVar90 + lVar153 + -1) - lVar157);
        local_870 = pdVar54 + ((lVar31 + lVar90 + lVar153 + -1) - lVar157);
        local_868 = pdVar54 + ((lVar90 + lVar153 + -1) - lVar157);
        while (lVar92 <= iVar28) {
          lVar97 = (lVar92 - iVar16) * lVar50;
          lVar1 = lVar92 + 1;
          lVar128 = (lVar92 - lVar91) * lVar53;
          lVar135 = (lVar92 - lVar165) * lVar34;
          lVar98 = (lVar92 - iVar6) * lVar39;
          lVar99 = (lVar92 - iVar23) * lVar62;
          lVar100 = (lVar92 - iVar179) * lVar30;
          iVar86 = (int)lVar92;
          iVar94 = iVar86 - iVar5;
          lVar101 = iVar94 * lVar34;
          lVar102 = ((lVar92 + -1) - lVar91) * lVar53;
          lVar103 = (lVar1 - lVar91) * lVar53;
          lVar176 = ((lVar92 + -1) - lVar165) * lVar34;
          lVar104 = (lVar1 - lVar165) * lVar34;
          lVar105 = (lVar92 - iVar21) * lVar58;
          lVar141 = ((int)lVar1 - iVar24) * lVar66;
          lVar142 = (lVar92 - iVar24) * lVar66;
          lVar106 = (int)(~uVar18 + iVar86) * lVar53;
          lVar107 = (int)((int)lVar1 - uVar18) * lVar53;
          lVar150 = (long)iVar25;
          while (lVar150 <= iVar27) {
            if (iVar26 < iVar186) {
              lVar150 = lVar150 + 1;
            }
            else {
              lVar108 = lVar150 - lVar123;
              lVar109 = (lVar150 - lVar180) * lVar52;
              lVar2 = lVar150 + -1;
              lVar113 = (lVar2 - lVar180) * lVar52;
              lVar121 = lVar150 + -2;
              lVar114 = (lVar121 - lVar180) * lVar52;
              lVar3 = lVar150 + 1;
              lVar115 = (lVar3 - lVar180) * lVar52;
              lVar4 = lVar150 + 2;
              lVar116 = (lVar150 - lVar164) * lVar33;
              lVar136 = (lVar150 - lVar167) * lVar38;
              lVar137 = (lVar2 - lVar164) * lVar33;
              lVar187 = (lVar3 - lVar164) * lVar33;
              lVar138 = (lVar121 - lVar164) * lVar33;
              lVar143 = (lVar150 - iVar22) * lVar61;
              lVar144 = (lVar150 - iVar19) * lVar55;
              iVar126 = (int)lVar150;
              iVar132 = iVar126 - iVar172;
              lVar145 = iVar132 * lVar33;
              iVar185 = (int)lVar3;
              lVar146 = (lVar150 - lVar181) * lVar57;
              lVar147 = (lVar150 - lVar184) * lVar65;
              lVar148 = (iVar185 - iVar127) * lVar52;
              lVar149 = ((int)lVar121 - iVar127) * lVar52;
              lVar140 = ((int)lVar121 - iVar172) * lVar33;
              iVar87 = (int)lVar2 - iVar19;
              iVar88 = (int)lVar2 - iVar172;
              lVar117 = iVar88 * lVar33;
              lVar118 = (lVar2 - lVar181) * lVar57;
              lVar119 = (lVar2 - lVar184) * lVar65;
              lVar129 = lVar150 - iVar8;
              lVar158 = (lVar2 - lVar167) * lVar38;
              lVar150 = (~(long)iVar19 + lVar150) * lVar55 * 8;
              pdVar173 = (double *)((long)local_878 + lVar150);
              pdVar159 = (double *)((long)local_870 + lVar150);
              pdVar151 = (double *)(lVar150 + (long)local_868);
              lVar121 = lVar153;
              iVar80 = iVar186 - uVar10;
              iVar81 = (iVar186 - uVar10) + -1;
              do {
                lVar150 = lVar121 - iVar15;
                uVar29 = pEVar48[lVar97 + lVar108 * lVar49 + lVar150].flag;
                local_9b8 = 0.0;
                dVar204 = 0.0;
                if ((short)uVar29 < 0) {
                  lVar168 = lVar121 - lVar124;
                  dVar192 = pdVar51[lVar109 + lVar168 + lVar128];
                  iVar161 = (int)lVar121;
                  if ((dVar192 != 1.0) || (NAN(dVar192))) {
LAB_003e20db:
                    local_8b8 = lVar121 - lVar182;
                    local_9c8 = pdVar60[lVar99 + lVar143 + local_8b8];
                    local_9c0 = (pdVar60 + lVar99 + lVar143 + local_8b8)[lVar63];
                    lVar93 = lVar121 - lVar157;
                    dVar204 = pdVar54[lVar100 + lVar144 + lVar93 + lVar31];
                    dVar191 = pdVar54[lVar100 + lVar144 + lVar93];
                    dVar199 = pdVar54[lVar100 + lVar144 + lVar93 + lVar31 * 2];
                    iVar162 = iVar161 - uVar10;
                    lVar120 = (long)iVar162;
                    dVar206 = pdVar32[lVar145 + lVar120 + lVar101 + lVar96];
                    dVar201 = pdVar32[lVar137 + lVar101 + lVar96 + lVar120];
                    iVar155 = 0;
                    cVar125 = '\x05';
                    pdVar110 = pdVar159;
                    pdVar169 = pdVar151;
                    pdVar174 = pdVar173;
                    for (lVar93 = -1; lVar93 != 2; lVar93 = lVar93 + 1) {
                      pdVar139 = pdVar110;
                      pdVar170 = pdVar169;
                      pdVar175 = pdVar174;
                      iVar112 = iVar155;
                      cVar130 = cVar125;
                      for (lVar177 = -1; iVar112 = iVar112 + 3, lVar177 != 2; lVar177 = lVar177 + 1)
                      {
                        lVar160 = (long)iVar155;
                        paRVar152 = A + lVar160;
                        iVar155 = iVar155 + 3;
                        for (lVar154 = 0; iVar112 - lVar160 != lVar154; lVar154 = lVar154 + 1) {
                          iVar89 = (int)lVar154 + -1;
                          if ((((int)lVar177 == 0 && (int)lVar93 == 0) && iVar89 == 0) ||
                             ((1 << (cVar130 + (char)lVar154 & 0x1fU) & uVar29) == 0)) {
                            (*paRVar152)[0] = 0.0;
                            (*paRVar152)[1] = 0.0;
                            (*paRVar152)[2] = 0.0;
                          }
                          else {
                            dVar208 = pdVar139[lVar154];
                            (*paRVar152)[0] = (pdVar170[lVar154] + (double)iVar89) - dVar191;
                            (*paRVar152)[1] = (dVar208 + (double)(int)lVar177) - dVar204;
                            (*paRVar152)[2] = (pdVar175[lVar154] + (double)(int)lVar93) - dVar199;
                          }
                          paRVar152 = paRVar152 + 1;
                        }
                        pdVar175 = pdVar175 + lVar55;
                        pdVar139 = pdVar139 + lVar55;
                        pdVar170 = pdVar170 + lVar55;
                        cVar130 = cVar130 + '\x03';
                      }
                      pdVar174 = pdVar174 + lVar30;
                      pdVar110 = pdVar110 + lVar30;
                      pdVar169 = pdVar169 + lVar30;
                      cVar125 = cVar125 + '\t';
                    }
                    iVar155 = 0;
                    cVar125 = '\x05';
                    for (lVar93 = -1; lVar93 != 2; lVar93 = lVar93 + 1) {
                      iVar112 = iVar155;
                      cVar130 = cVar125;
                      for (lVar177 = -1; iVar112 = iVar112 + 3, lVar177 != 2; lVar177 = lVar177 + 1)
                      {
                        lVar154 = (long)iVar155;
                        iVar155 = iVar155 + 3;
                        for (lVar160 = 0; iVar112 - lVar154 != lVar160; lVar160 = lVar160 + 1) {
                          RVar190 = 0.0;
                          if (((int)lVar160 != 1 || ((int)lVar177 != 0 || (int)lVar93 != 0)) &&
                             ((1 << (cVar130 + (char)lVar160 & 0x1fU) & uVar29) != 0)) {
                            RVar190 = pdVar32[lVar96 + (iVar94 + (int)lVar93) * lVar34 +
                                                       (iVar132 + (int)lVar177) * lVar33 +
                                                       (long)(iVar81 + (int)lVar160)] - dVar206;
                          }
                          du[lVar154 + lVar160] = RVar190;
                        }
                        cVar130 = cVar130 + '\x03';
                      }
                      cVar125 = cVar125 + '\t';
                    }
                    pdVar110 = &local_408;
                    for (lVar93 = 0; lVar177 = -0x48, lVar93 != 3; lVar93 = lVar93 + 1) {
                      for (; lVar177 != 0; lVar177 = lVar177 + 0x18) {
                        *(undefined8 *)((long)pdVar110 + lVar177 + 0x48) = 0;
                      }
                      local_6e8[lVar93] = 0.0;
                      pdVar110 = pdVar110 + 1;
                    }
                    pRVar111 = A[0] + 2;
                    dVar208 = local_3c8;
                    dVar200 = local_3e8;
                    dVar202 = local_3f8;
                    dVar212 = local_6e8[0];
                    dVar213 = local_408;
                    dVar214 = dStack_3e0;
                    dVar215 = local_400;
                    dVar203 = local_6e8[1];
                    dVar205 = local_6e8[2];
                    for (lVar93 = 0; lVar93 != 0x1b; lVar93 = lVar93 + 1) {
                      dVar207 = (*(Real (*) [3])(pRVar111 + -2))[0];
                      dVar209 = pRVar111[-1];
                      dVar195 = *pRVar111;
                      dVar200 = dVar200 + dVar209 * pRVar111[-1];
                      dVar202 = dVar202 + dVar207 * *pRVar111;
                      dVar214 = dVar214 + dVar195 * dVar209;
                      dVar215 = dVar215 + dVar209 * dVar207;
                      dVar208 = dVar208 + dVar195 * dVar195;
                      dVar195 = du[lVar93];
                      dVar212 = dVar212 + dVar207 * dVar195;
                      dVar213 = dVar213 + dVar207 * dVar207;
                      dVar203 = dVar203 + dVar195 * pRVar111[-1];
                      dVar205 = dVar205 + dVar195 * *pRVar111;
                      pRVar111 = pRVar111 + 3;
                    }
                    dVar195 = dVar215 * dVar208 - dVar202 * dVar214;
                    dVar207 = dVar215 * dVar205 - dVar202 * dVar203;
                    dVar210 = dVar215 * dVar214 + dVar202 * -dVar200;
                    dVar209 = dVar208 * dVar200 - dVar214 * dVar214;
                    dVar208 = dVar208 * dVar203 - dVar214 * dVar205;
                    auVar193._0_8_ =
                         dVar202 * (dVar214 * dVar203 - dVar205 * dVar200) +
                         (dVar212 * dVar209 - dVar208 * dVar215);
                    auVar193._8_8_ = dVar202 * dVar207 + (dVar213 * dVar208 - dVar195 * dVar212);
                    dVar202 = dVar210 * dVar202 + (dVar209 * dVar213 - dVar195 * dVar215);
                    auVar197._8_8_ = dVar202;
                    auVar197._0_8_ = dVar202;
                    auVar193 = divpd(auVar193,auVar197);
                    dVar202 = (dVar210 * dVar212 +
                              ((dVar205 * dVar200 + -dVar203 * dVar214) * dVar213 -
                              dVar207 * dVar215)) / dVar202;
                    dVar208 = auVar193._0_8_;
                    dVar200 = auVar193._8_8_;
                    if ((dVar192 == 1.0) && (!NAN(dVar192))) {
                      if ((pdVar51[lVar109 + lVar128 + ((lVar121 + -1) - lVar124)] == 1.0) &&
                         (!NAN(pdVar51[lVar109 + lVar128 + ((lVar121 + -1) - lVar124)]))) {
                        if ((pdVar51[lVar109 + lVar128 + ((lVar121 + 1) - lVar124)] == 1.0) &&
                           (!NAN(pdVar51[lVar109 + lVar128 + ((lVar121 + 1) - lVar124)]))) {
                          dVar214 = dVar206 - pdVar32[lVar145 + lVar101 + lVar96 + ((lVar121 + -1) -
                                                                                   lVar134)];
                          dVar215 = pdVar32[lVar145 + lVar101 + lVar96 + ((lVar121 + 1) - lVar134)]
                                    - dVar206;
                          dVar214 = dVar214 + dVar214;
                          dVar215 = dVar215 + dVar215;
                          dVar212 = (pdVar32[lVar145 + lVar101 + lVar96 + ((lVar121 + 1) - lVar134)]
                                    - pdVar32[lVar145 + lVar101 + lVar96 + ((lVar121 + -1) - lVar134
                                                                           )]) * 0.5;
                          dVar213 = ABS(dVar214);
                          uVar188 = -(ulong)(0.0 < dVar212);
                          dVar212 = ABS(dVar212);
                          dVar208 = ABS(dVar215);
                          if (dVar213 <= dVar212) {
                            dVar212 = dVar213;
                          }
                          if (dVar212 <= dVar208) {
                            dVar208 = dVar212;
                          }
                          uVar196 = -(ulong)(0.0 < dVar214 * dVar215) & (ulong)dVar208;
                          dVar208 = (double)(~uVar188 & (uVar196 ^ 0x8000000000000000) |
                                            uVar188 & uVar196);
                        }
                      }
                      if ((((pdVar51[lVar113 + lVar128 + lVar168] == 1.0) &&
                           (!NAN(pdVar51[lVar113 + lVar128 + lVar168]))) &&
                          (pdVar51[lVar128 + lVar115 + lVar168] == 1.0)) &&
                         (!NAN(pdVar51[lVar128 + lVar115 + lVar168]))) {
                        dVar214 = pdVar32[lVar187 + lVar101 + lVar96 + lVar120] - dVar206;
                        dVar213 = (dVar206 - dVar201) + (dVar206 - dVar201);
                        dVar214 = dVar214 + dVar214;
                        dVar212 = (pdVar32[lVar187 + lVar101 + lVar96 + lVar120] - dVar201) * 0.5;
                        dVar215 = ABS(dVar213);
                        uVar188 = -(ulong)(0.0 < dVar212);
                        dVar212 = ABS(dVar212);
                        dVar200 = ABS(dVar214);
                        if (dVar215 <= dVar212) {
                          dVar212 = dVar215;
                        }
                        if (dVar212 <= dVar200) {
                          dVar200 = dVar212;
                        }
                        uVar196 = -(ulong)(0.0 < dVar213 * dVar214) & (ulong)dVar200;
                        dVar200 = (double)(~uVar188 & (uVar196 ^ 0x8000000000000000) |
                                          uVar188 & uVar196);
                      }
                      if (((pdVar51[lVar109 + lVar168 + lVar102] == 1.0) &&
                          (!NAN(pdVar51[lVar109 + lVar168 + lVar102]))) &&
                         ((pdVar51[lVar109 + lVar168 + lVar103] == 1.0 &&
                          (!NAN(pdVar51[lVar109 + lVar168 + lVar103]))))) {
                        dVar214 = dVar206 - pdVar32[lVar145 + lVar120 + lVar176 + lVar96];
                        dVar215 = pdVar32[lVar145 + lVar120 + lVar104 + lVar96] - dVar206;
                        dVar214 = dVar214 + dVar214;
                        dVar215 = dVar215 + dVar215;
                        dVar212 = (pdVar32[lVar145 + lVar120 + lVar104 + lVar96] -
                                  pdVar32[lVar145 + lVar120 + lVar176 + lVar96]) * 0.5;
                        dVar213 = ABS(dVar214);
                        uVar188 = -(ulong)(0.0 < dVar212);
                        dVar212 = ABS(dVar212);
                        dVar202 = ABS(dVar215);
                        if (dVar213 <= dVar212) {
                          dVar212 = dVar213;
                        }
                        if (dVar212 <= dVar202) {
                          dVar202 = dVar212;
                        }
                        uVar196 = -(ulong)(0.0 < dVar214 * dVar215) & (ulong)dVar202;
                        dVar202 = (double)(~uVar188 & (uVar196 ^ 0x8000000000000000) |
                                          uVar188 & uVar196);
                      }
                    }
                    local_9b8 = dVar201;
                    if (dVar206 <= dVar201) {
                      local_9b8 = dVar206;
                    }
                    if (dVar201 <= dVar206) {
                      dVar201 = dVar206;
                    }
                    iVar89 = 0;
                    iVar155 = 0;
                    iVar156 = 0;
                    iVar163 = 0;
                    iVar112 = -1;
                    while (iVar112 != 2) {
                      iVar133 = iVar89;
                      iVar171 = -1;
                      while (iVar171 != 2) {
                        for (iVar178 = 5; iVar178 != 8; iVar178 = iVar178 + 1) {
                          if (((uVar29 >> (iVar133 + iVar178 & 0x1fU) & 1) != 0) &&
                             ((iVar178 != 6 || iVar171 != 0) || iVar112 != 0)) {
                            iVar163 = iVar163 + (uint)((iVar178 - 5U & 0xfffffffd) == 0 &&
                                                      (iVar171 == 0 && iVar112 == 0));
                            iVar156 = iVar156 + (uint)((iVar178 == 6 && iVar112 == 0) &&
                                                      (iVar171 == 1 || iVar171 + 1 == 0));
                            iVar155 = iVar155 + (uint)((iVar178 == 6 && iVar171 == 0) &&
                                                      (iVar112 == 1 || iVar112 + 1 == 0));
                          }
                        }
                        iVar133 = iVar133 + 3;
                        iVar171 = iVar171 + 1;
                      }
                      iVar89 = iVar89 + 9;
                      iVar112 = iVar112 + 1;
                    }
                    dVar212 = 2.0;
                    if ((uVar29 >> 0x15 & 1) != 0) {
                      cVar125 = '\b';
                      dVar212 = dVar206;
                      dVar213 = dVar206;
                      for (lVar93 = -1; lVar93 != 2; lVar93 = lVar93 + 1) {
                        cVar130 = cVar125;
                        for (lVar177 = 0; lVar177 != 2; lVar177 = lVar177 + 1) {
                          for (lVar154 = 0; lVar154 != 3; lVar154 = lVar154 + 1) {
                            if (((int)lVar154 != 1 || ((int)lVar177 != 0 || (int)lVar93 != 0)) &&
                               ((1 << (cVar130 + (char)lVar154 & 0x1fU) & uVar29) != 0)) {
                              dVar214 = pdVar32[lVar96 + (iVar94 + (int)lVar93) * lVar34 +
                                                         (iVar132 + (int)lVar177) * lVar33 +
                                                         (long)(iVar81 + (int)lVar154)];
                              dVar215 = dVar214;
                              if (dVar214 <= dVar212) {
                                dVar215 = dVar212;
                              }
                              dVar212 = dVar215;
                              if (dVar214 < dVar213) {
                                dVar213 = dVar214;
                              }
                            }
                          }
                          cVar130 = cVar130 + '\x03';
                        }
                        cVar125 = cVar125 + '\t';
                      }
                      dVar214 = (((pdVar60 + lVar99 + (iVar185 - iVar22) * lVar61 + local_8b8)
                                  [lVar63] - dVar199) * dVar202 +
                                (0.5 - dVar204) * dVar200 +
                                (pdVar60[lVar99 + (iVar185 - iVar22) * lVar61 + local_8b8] - dVar191
                                ) * dVar208 + dVar206) - dVar206;
                      if (dVar214 <= 1e-13) {
                        dVar212 = 1.0;
                        if (dVar214 < -1e-13) {
                          dVar212 = (dVar213 - dVar206) / dVar214;
                          if (1.0 <= dVar212) {
                            dVar212 = 1.0;
                          }
                        }
                      }
                      else {
                        dVar212 = (dVar212 - dVar206) / dVar214;
                        if (1.0 <= dVar212) {
                          dVar212 = 1.0;
                        }
                      }
                      if (2.0 <= dVar212) {
                        dVar212 = 2.0;
                      }
                    }
                    cVar125 = '\x05';
                    dVar213 = dVar206;
                    dVar214 = dVar206;
                    for (lVar93 = -1; lVar93 != 2; lVar93 = lVar93 + 1) {
                      cVar130 = cVar125;
                      for (lVar177 = -1; lVar177 != 1; lVar177 = lVar177 + 1) {
                        for (lVar154 = 0; lVar154 != 3; lVar154 = lVar154 + 1) {
                          if (((int)lVar154 != 1 || ((int)lVar177 != 0 || (int)lVar93 != 0)) &&
                             ((1 << (cVar130 + (char)lVar154 & 0x1fU) & uVar29) != 0)) {
                            dVar215 = pdVar32[lVar96 + (iVar94 + (int)lVar93) * lVar34 +
                                                       (iVar132 + (int)lVar177) * lVar33 +
                                                       (long)(iVar81 + (int)lVar154)];
                            dVar203 = dVar215;
                            if (dVar215 <= dVar214) {
                              dVar203 = dVar214;
                            }
                            dVar214 = dVar203;
                            if (dVar215 < dVar213) {
                              dVar213 = dVar215;
                            }
                          }
                        }
                        cVar130 = cVar130 + '\x03';
                      }
                      cVar125 = cVar125 + '\t';
                    }
                    dVar215 = ((local_9c0 - dVar199) * dVar202 +
                              (((local_9c8 - dVar191) * dVar208 + dVar206) -
                              (dVar204 + 0.5) * dVar200)) - dVar206;
                    if (dVar215 <= 1e-13) {
                      dVar214 = 1.0;
                      if ((dVar215 < -1e-13) &&
                         (dVar214 = (dVar213 - dVar206) / dVar215, 1.0 <= dVar214)) {
                        dVar214 = 1.0;
                      }
                    }
                    else {
                      dVar214 = (dVar214 - dVar206) / dVar215;
                      if (1.0 <= dVar214) {
                        dVar214 = 1.0;
                      }
                    }
                    if (dVar212 <= dVar214) {
                      dVar214 = dVar212;
                    }
                    dVar212 = dVar214;
                    if ((uVar29 >> 0x13 & 1) != 0) {
                      cVar125 = '\x06';
                      dVar213 = dVar206;
                      dVar212 = dVar206;
                      for (lVar93 = -1; lVar93 != 2; lVar93 = lVar93 + 1) {
                        cVar130 = cVar125;
                        for (lVar177 = -1; lVar177 != 2; lVar177 = lVar177 + 1) {
                          for (lVar154 = 0; lVar154 != 2; lVar154 = lVar154 + 1) {
                            dVar215 = dVar213;
                            if ((((int)lVar177 != 0 || (int)lVar93 != 0) || (int)lVar154 != 0) &&
                               ((1 << (cVar130 + (char)lVar154 & 0x1fU) & uVar29) != 0)) {
                              dVar215 = pdVar32[lVar96 + (iVar94 + (int)lVar93) * lVar34 +
                                                         (iVar132 + (int)lVar177) * lVar33 +
                                                         (long)(iVar80 + (int)lVar154)];
                              dVar203 = dVar215;
                              if (dVar215 <= dVar212) {
                                dVar203 = dVar212;
                              }
                              dVar212 = dVar203;
                              if (dVar213 <= dVar215) {
                                dVar215 = dVar213;
                              }
                            }
                            dVar213 = dVar215;
                          }
                          cVar130 = cVar130 + '\x03';
                        }
                        cVar125 = cVar125 + '\t';
                      }
                      dVar215 = (((pdVar56 + lVar105 + lVar146 + ((iVar161 - iVar20) + 1))[lVar59] -
                                 dVar199) * dVar202 +
                                (pdVar56[lVar105 + lVar146 + ((iVar161 - iVar20) + 1)] - dVar204) *
                                dVar200 + (0.5 - dVar191) * dVar208 + dVar206) - dVar206;
                      if (dVar215 <= 1e-13) {
                        dVar212 = 1.0;
                        if (dVar215 < -1e-13) {
                          dVar212 = (dVar213 - dVar206) / dVar215;
                          if (1.0 <= dVar212) {
                            dVar212 = 1.0;
                          }
                        }
                      }
                      else {
                        dVar212 = (dVar212 - dVar206) / dVar215;
                        if (1.0 <= dVar212) {
                          dVar212 = 1.0;
                        }
                      }
                      if (dVar214 <= dVar212) {
                        dVar212 = dVar214;
                      }
                    }
                    dVar213 = dVar212;
                    if ((uVar29 >> 0x11 & 1) != 0) {
                      cVar125 = '\x05';
                      dVar213 = dVar206;
                      dVar214 = dVar206;
                      for (lVar93 = -1; lVar93 != 2; lVar93 = lVar93 + 1) {
                        cVar130 = cVar125;
                        for (lVar177 = -1; lVar177 != 2; lVar177 = lVar177 + 1) {
                          for (lVar154 = 0; lVar154 != 2; lVar154 = lVar154 + 1) {
                            dVar215 = dVar214;
                            if (((int)lVar154 != 1 || ((int)lVar177 != 0 || (int)lVar93 != 0)) &&
                               ((1 << (cVar130 + (char)lVar154 & 0x1fU) & uVar29) != 0)) {
                              dVar215 = pdVar32[lVar96 + (iVar94 + (int)lVar93) * lVar34 +
                                                         (iVar132 + (int)lVar177) * lVar33 +
                                                         (long)(iVar81 + (int)lVar154)];
                              dVar203 = dVar215;
                              if (dVar215 <= dVar213) {
                                dVar203 = dVar213;
                              }
                              dVar213 = dVar203;
                              if (dVar214 <= dVar215) {
                                dVar215 = dVar214;
                              }
                            }
                            dVar214 = dVar215;
                          }
                          cVar130 = cVar130 + '\x03';
                        }
                        cVar125 = cVar125 + '\t';
                      }
                      dVar215 = (((pdVar56 + lVar105 + lVar146 + (lVar121 - iVar20))[lVar59] -
                                 dVar199) * dVar202 +
                                (pdVar56[lVar105 + lVar146 + (lVar121 - iVar20)] - dVar204) *
                                dVar200 + (dVar206 - (dVar191 + 0.5) * dVar208)) - dVar206;
                      if (dVar215 <= 1e-13) {
                        dVar213 = 1.0;
                        if ((dVar215 < -1e-13) &&
                           (dVar213 = (dVar214 - dVar206) / dVar215, 1.0 <= dVar213)) {
                          dVar213 = 1.0;
                        }
                      }
                      else {
                        dVar213 = (dVar213 - dVar206) / dVar215;
                        if (1.0 <= dVar213) {
                          dVar213 = 1.0;
                        }
                      }
                      if (dVar212 <= dVar213) {
                        dVar213 = dVar212;
                      }
                    }
                    dVar212 = dVar213;
                    if ((uVar29 >> 0x1b & 1) != 0) {
                      cVar125 = '\x0e';
                      dVar212 = dVar206;
                      dVar214 = dVar206;
                      for (lVar93 = 0; lVar93 != 2; lVar93 = lVar93 + 1) {
                        cVar130 = cVar125;
                        for (lVar177 = -1; lVar177 != 2; lVar177 = lVar177 + 1) {
                          for (lVar154 = 0; lVar154 != 3; lVar154 = lVar154 + 1) {
                            dVar215 = dVar214;
                            if (((int)lVar154 != 1 || ((int)lVar177 != 0 || (int)lVar93 != 0)) &&
                               ((1 << (cVar130 + (char)lVar154 & 0x1fU) & uVar29) != 0)) {
                              dVar215 = pdVar32[lVar96 + (iVar94 + (int)lVar93) * lVar34 +
                                                         (iVar132 + (int)lVar177) * lVar33 +
                                                         (long)(iVar81 + (int)lVar154)];
                              dVar203 = dVar215;
                              if (dVar215 <= dVar212) {
                                dVar203 = dVar212;
                              }
                              dVar212 = dVar203;
                              if (dVar214 <= dVar215) {
                                dVar215 = dVar214;
                              }
                            }
                            dVar214 = dVar215;
                          }
                          cVar130 = cVar130 + '\x03';
                        }
                        cVar125 = cVar125 + '\t';
                      }
                      dVar215 = ((0.5 - dVar199) * dVar202 +
                                ((pdVar64 + lVar147 + lVar141 + (lVar121 - lVar183))[lVar67] -
                                dVar204) * dVar200 +
                                (pdVar64[lVar147 + lVar141 + (lVar121 - lVar183)] - dVar191) *
                                dVar208 + dVar206) - dVar206;
                      if (dVar215 <= 1e-13) {
                        dVar212 = 1.0;
                        if (dVar215 < -1e-13) {
                          dVar212 = (dVar214 - dVar206) / dVar215;
                          if (1.0 <= dVar212) {
                            dVar212 = 1.0;
                          }
                        }
                      }
                      else {
                        dVar212 = (dVar212 - dVar206) / dVar215;
                        if (1.0 <= dVar212) {
                          dVar212 = 1.0;
                        }
                      }
                      if (dVar213 <= dVar212) {
                        dVar212 = dVar213;
                      }
                    }
                    dVar213 = dVar212;
                    if ((uVar29 >> 9 & 1) != 0) {
                      cVar125 = '\x05';
                      dVar214 = dVar206;
                      dVar213 = dVar206;
                      for (lVar93 = -1; lVar93 != 1; lVar93 = lVar93 + 1) {
                        cVar130 = cVar125;
                        for (lVar177 = -1; lVar177 != 2; lVar177 = lVar177 + 1) {
                          for (lVar154 = 0; lVar154 != 3; lVar154 = lVar154 + 1) {
                            dVar215 = dVar214;
                            if (((int)lVar154 != 1 || ((int)lVar177 != 0 || (int)lVar93 != 0)) &&
                               ((1 << (cVar130 + (char)lVar154 & 0x1fU) & uVar29) != 0)) {
                              dVar215 = pdVar32[lVar96 + (iVar94 + (int)lVar93) * lVar34 +
                                                         (iVar132 + (int)lVar177) * lVar33 +
                                                         (long)(iVar81 + (int)lVar154)];
                              dVar203 = dVar215;
                              if (dVar215 <= dVar213) {
                                dVar203 = dVar213;
                              }
                              dVar213 = dVar203;
                              if (dVar214 <= dVar215) {
                                dVar215 = dVar214;
                              }
                            }
                            dVar214 = dVar215;
                          }
                          cVar130 = cVar130 + '\x03';
                        }
                        cVar125 = cVar125 + '\t';
                      }
                      dVar215 = ((((pdVar64 + lVar147 + lVar142 + (lVar121 - lVar183))[lVar67] -
                                  dVar204) * dVar200 +
                                 (pdVar64[lVar147 + lVar142 + (lVar121 - lVar183)] - dVar191) *
                                 dVar208 + dVar206) - (dVar199 + 0.5) * dVar202) - dVar206;
                      if (dVar215 <= 1e-13) {
                        dVar213 = 1.0;
                        if (dVar215 < -1e-13) {
                          dVar213 = (dVar214 - dVar206) / dVar215;
                          if (1.0 <= dVar213) {
                            dVar213 = 1.0;
                          }
                        }
                      }
                      else {
                        dVar213 = (dVar213 - dVar206) / dVar215;
                        if (1.0 <= dVar213) {
                          dVar213 = 1.0;
                        }
                      }
                      if (dVar212 <= dVar213) {
                        dVar213 = dVar212;
                      }
                    }
                    dVar212 = 0.0;
                    if (1 < iVar163) {
                      dVar212 = dVar213;
                    }
                    dVar214 = 0.0;
                    if (1 < iVar156) {
                      dVar214 = dVar213;
                    }
                    dVar215 = 0.0;
                    if (1 < iVar155) {
                      dVar215 = dVar213;
                    }
                    if ((dVar192 != 1.0) || (NAN(dVar192))) {
                      dVar213 = pdVar51[lVar113 + lVar128 + lVar168];
                    }
                    else {
                      if ((((pdVar51[lVar109 + lVar128 + (int)(~uVar17 + iVar161)] == 1.0) &&
                           (!NAN(pdVar51[lVar109 + lVar128 + (int)(~uVar17 + iVar161)]))) &&
                          (pdVar51[lVar109 + lVar128 + (int)((iVar161 - uVar17) + 1)] == 1.0)) &&
                         (!NAN(pdVar51[lVar109 + lVar128 + (int)((iVar161 - uVar17) + 1)]))) {
                        dVar212 = 1.0;
                      }
                      dVar213 = pdVar51[lVar113 + lVar128 + lVar168];
                      if (((dVar213 == 1.0) && (!NAN(dVar213))) &&
                         ((pdVar51[lVar128 + lVar148 + lVar168] == 1.0 &&
                          (!NAN(pdVar51[lVar128 + lVar148 + lVar168]))))) {
                        dVar214 = 1.0;
                      }
                      if (((pdVar51[lVar109 + lVar168 + lVar106] == 1.0) &&
                          (!NAN(pdVar51[lVar109 + lVar168 + lVar106]))) &&
                         ((pdVar51[lVar109 + lVar168 + lVar107] == 1.0 &&
                          (!NAN(pdVar51[lVar109 + lVar168 + lVar107]))))) {
                        dVar215 = 1.0;
                      }
                    }
                    dVar204 = (local_9c0 - dVar199) * dVar202 * dVar215 +
                              (local_9c8 - dVar191) * dVar208 * dVar212 +
                              (-0.5 - dVar204) * dVar200 * dVar214 + dVar206;
                    if (dVar204 <= dVar201) {
                      dVar201 = dVar204;
                    }
                    if (local_9b8 <= dVar201) {
                      local_9b8 = dVar201;
                    }
                    local_9b8 = pdVar37[lVar36 + lVar98 + lVar136 + (lVar121 - lVar166)] *
                                dVar189 * -0.5 * dVar200 * dVar214 + local_9b8;
                    local_9d8 = pdVar51 + lVar113 + lVar168;
                    if ((dVar213 == 1.0) && (!NAN(dVar213))) goto LAB_003e3986;
                    bVar82 = false;
LAB_003e3d85:
                    pdVar110 = pdVar54 + (iVar86 - iVar179) * lVar30 +
                                         iVar87 * lVar55 + (long)(int)(iVar161 - uVar9);
                    dVar191 = pdVar110[lVar31];
                    dVar199 = *pdVar110;
                    dVar206 = pdVar110[lVar31 * 2];
                    dVar201 = pdVar32[lVar116 + lVar101 + lVar96 + lVar120];
                    dVar208 = pdVar32[lVar117 + lVar120 + lVar101 + lVar96];
                    uVar29 = pEVar48[lVar97 + (lVar2 - lVar123) * lVar49 + lVar150].flag;
                    iVar155 = 0;
                    cVar125 = '\x05';
                    for (lVar150 = -1; lVar150 != 2; lVar150 = lVar150 + 1) {
                      iVar89 = (int)lVar150;
                      iVar112 = iVar155;
                      cVar130 = cVar125;
                      for (lVar93 = -1; iVar112 = iVar112 + 3, lVar93 != 2; lVar93 = lVar93 + 1) {
                        lVar154 = (long)iVar155;
                        paRVar152 = A + lVar154;
                        iVar156 = (int)lVar93;
                        iVar155 = iVar155 + 3;
                        for (lVar177 = 0; iVar112 - lVar154 != lVar177; lVar177 = lVar177 + 1) {
                          iVar163 = (int)lVar177 + -1;
                          if (((iVar156 == 0 && iVar89 == 0) && iVar163 == 0) ||
                             ((1 << (cVar130 + (char)lVar177 & 0x1fU) & uVar29) == 0)) {
                            (*paRVar152)[0] = 0.0;
                            (*paRVar152)[1] = 0.0;
                            (*paRVar152)[2] = 0.0;
                          }
                          else {
                            pdVar110 = pdVar54 + ((iVar86 - iVar179) + iVar89) * lVar30 +
                                                 (iVar87 + iVar156) * lVar55 +
                                                 (long)(int)(~uVar9 + iVar161 + (int)lVar177);
                            dVar204 = pdVar110[lVar31];
                            (*paRVar152)[0] = (*pdVar110 + (double)iVar163) - dVar199;
                            (*paRVar152)[1] = (dVar204 + (double)iVar156) - dVar191;
                            (*paRVar152)[2] = (pdVar110[lVar31 * 2] + (double)iVar89) - dVar206;
                          }
                          paRVar152 = paRVar152 + 1;
                        }
                        cVar130 = cVar130 + '\x03';
                      }
                      cVar125 = cVar125 + '\t';
                    }
                    iVar155 = 0;
                    cVar125 = '\x05';
                    for (lVar150 = -1; lVar150 != 2; lVar150 = lVar150 + 1) {
                      iVar112 = iVar155;
                      cVar130 = cVar125;
                      for (lVar93 = -1; iVar112 = iVar112 + 3, lVar93 != 2; lVar93 = lVar93 + 1) {
                        lVar177 = (long)iVar155;
                        iVar155 = iVar155 + 3;
                        for (lVar154 = 0; iVar112 - lVar177 != lVar154; lVar154 = lVar154 + 1) {
                          RVar190 = 0.0;
                          if (((int)lVar154 != 1 || ((int)lVar93 != 0 || (int)lVar150 != 0)) &&
                             ((1 << (cVar130 + (char)lVar154 & 0x1fU) & uVar29) != 0)) {
                            RVar190 = pdVar32[lVar96 + (iVar94 + (int)lVar150) * lVar34 +
                                                       (iVar88 + (int)lVar93) * lVar33 +
                                                       (long)(iVar162 + -1 + (int)lVar154)] -
                                      dVar208;
                          }
                          du[lVar177 + lVar154] = RVar190;
                        }
                        cVar130 = cVar130 + '\x03';
                      }
                      cVar125 = cVar125 + '\t';
                    }
                    pdVar110 = &local_408;
                    for (lVar150 = 0; lVar93 = -0x48, lVar150 != 3; lVar150 = lVar150 + 1) {
                      for (; lVar93 != 0; lVar93 = lVar93 + 0x18) {
                        *(undefined8 *)((long)pdVar110 + lVar93 + 0x48) = 0;
                      }
                      local_6e8[lVar150] = 0.0;
                      pdVar110 = pdVar110 + 1;
                    }
                    pRVar111 = A[0] + 1;
                    dVar204 = local_3e8;
                    dVar200 = local_3c8;
                    dVar202 = dStack_3e0;
                    dVar212 = local_400;
                    dVar214 = local_3f8;
                    dVar215 = local_6e8[0];
                    dVar203 = local_408;
                    dVar205 = local_6e8[1];
                    dVar195 = local_6e8[2];
                    for (lVar150 = 0; lVar150 != 0x1b; lVar150 = lVar150 + 1) {
                      dVar207 = (*(Real (*) [3])(pRVar111 + -1))[0];
                      dVar210 = *pRVar111;
                      dVar211 = pRVar111[1];
                      dVar209 = du[lVar150];
                      dVar214 = dVar214 + dVar211 * dVar207;
                      dVar202 = dVar202 + dVar211 * dVar210;
                      dVar212 = dVar212 + dVar210 * dVar207;
                      dVar204 = dVar204 + dVar210 * dVar210;
                      dVar200 = dVar200 + dVar211 * dVar211;
                      dVar215 = dVar215 + dVar207 * dVar209;
                      dVar203 = dVar203 + dVar207 * dVar207;
                      dVar205 = dVar205 + dVar209 * dVar210;
                      dVar195 = dVar195 + dVar209 * dVar211;
                      pRVar111 = pRVar111 + 3;
                    }
                    dVar207 = dVar200 * dVar212 - dVar214 * dVar202;
                    dVar209 = dVar195 * dVar212 - dVar214 * dVar205;
                    dVar211 = dVar212 * dVar202 + dVar214 * -dVar204;
                    dVar210 = dVar200 * dVar204 - dVar202 * dVar202;
                    dVar200 = dVar205 * dVar200 - dVar202 * dVar195;
                    auVar198._0_8_ =
                         dVar214 * (dVar205 * dVar202 - dVar195 * dVar204) +
                         (dVar215 * dVar210 - dVar200 * dVar212);
                    auVar198._8_8_ = dVar214 * dVar209 + (dVar203 * dVar200 - dVar207 * dVar215);
                    dVar214 = dVar211 * dVar214 + (dVar210 * dVar203 - dVar207 * dVar212);
                    auVar194._8_8_ = dVar214;
                    auVar194._0_8_ = dVar214;
                    auVar193 = divpd(auVar198,auVar194);
                    dVar214 = (dVar211 * dVar215 +
                              ((dVar195 * dVar204 + -dVar205 * dVar202) * dVar203 -
                              dVar209 * dVar212)) / dVar214;
                    dVar200 = auVar193._0_8_;
                    dVar202 = auVar193._8_8_;
                    if (bVar82) {
                      if ((pdVar51[lVar113 + lVar128 + ((lVar121 + -1) - lVar124)] == 1.0) &&
                         (!NAN(pdVar51[lVar113 + lVar128 + ((lVar121 + -1) - lVar124)]))) {
                        if ((pdVar51[lVar113 + lVar128 + ((lVar121 + 1) - lVar124)] == 1.0) &&
                           (!NAN(pdVar51[lVar113 + lVar128 + ((lVar121 + 1) - lVar124)]))) {
                          dVar212 = dVar208 - pdVar32[lVar117 + lVar101 + lVar96 + ((lVar121 + -1) -
                                                                                   lVar134)];
                          dVar215 = pdVar32[lVar117 + lVar101 + lVar96 + ((lVar121 + 1) - lVar134)]
                                    - dVar208;
                          dVar212 = dVar212 + dVar212;
                          dVar215 = dVar215 + dVar215;
                          dVar204 = (pdVar32[lVar117 + lVar101 + lVar96 + ((lVar121 + 1) - lVar134)]
                                    - pdVar32[lVar117 + lVar101 + lVar96 + ((lVar121 + -1) - lVar134
                                                                           )]) * 0.5;
                          dVar203 = ABS(dVar212);
                          uVar188 = -(ulong)(0.0 < dVar204);
                          dVar204 = ABS(dVar204);
                          dVar200 = ABS(dVar215);
                          if (dVar203 <= dVar204) {
                            dVar204 = dVar203;
                          }
                          if (dVar204 <= dVar200) {
                            dVar200 = dVar204;
                          }
                          uVar196 = -(ulong)(0.0 < dVar212 * dVar215) & (ulong)dVar200;
                          dVar200 = (double)(~uVar188 & (uVar196 ^ 0x8000000000000000) |
                                            uVar188 & uVar196);
                        }
                      }
                      if ((((dVar192 == 1.0) && (!NAN(dVar192))) &&
                          (pdVar51[lVar128 + lVar114 + lVar168] == 1.0)) &&
                         (!NAN(pdVar51[lVar128 + lVar114 + lVar168]))) {
                        dVar215 = dVar208 - pdVar32[lVar138 + lVar101 + lVar96 + lVar120];
                        dVar212 = (dVar201 - dVar208) + (dVar201 - dVar208);
                        dVar215 = dVar215 + dVar215;
                        dVar204 = (dVar201 - pdVar32[lVar138 + lVar101 + lVar96 + lVar120]) * 0.5;
                        dVar203 = ABS(dVar215);
                        uVar188 = -(ulong)(0.0 < dVar204);
                        dVar204 = ABS(dVar204);
                        dVar202 = ABS(dVar212);
                        if (dVar203 <= dVar204) {
                          dVar204 = dVar203;
                        }
                        if (dVar204 <= dVar202) {
                          dVar202 = dVar204;
                        }
                        uVar196 = -(ulong)(0.0 < dVar215 * dVar212) & (ulong)dVar202;
                        dVar202 = (double)(~uVar188 & (uVar196 ^ 0x8000000000000000) |
                                          uVar188 & uVar196);
                      }
                      if (((local_9d8[lVar102] == 1.0) && (!NAN(local_9d8[lVar102]))) &&
                         ((local_9d8[lVar103] == 1.0 && (!NAN(local_9d8[lVar103]))))) {
                        dVar215 = dVar208 - pdVar32[lVar117 + lVar120 + lVar176 + lVar96];
                        dVar203 = pdVar32[lVar117 + lVar120 + lVar104 + lVar96] - dVar208;
                        dVar215 = dVar215 + dVar215;
                        dVar203 = dVar203 + dVar203;
                        dVar212 = (pdVar32[lVar117 + lVar120 + lVar104 + lVar96] -
                                  pdVar32[lVar117 + lVar120 + lVar176 + lVar96]) * 0.5;
                        dVar214 = ABS(dVar215);
                        uVar188 = -(ulong)(0.0 < dVar212);
                        dVar212 = ABS(dVar212);
                        dVar204 = ABS(dVar203);
                        if (dVar214 <= dVar212) {
                          dVar212 = dVar214;
                        }
                        if (dVar212 <= dVar204) {
                          dVar204 = dVar212;
                        }
                        uVar196 = -(ulong)(0.0 < dVar215 * dVar203) & (ulong)dVar204;
                        dVar214 = (double)(~uVar188 & (uVar196 ^ 0x8000000000000000) |
                                          uVar188 & uVar196);
                      }
                    }
                    dVar204 = dVar208;
                    if (dVar201 <= dVar208) {
                      dVar204 = dVar201;
                    }
                    dVar212 = dVar208;
                    if (dVar208 <= dVar201) {
                      dVar212 = dVar201;
                    }
                    iVar89 = 0;
                    iVar156 = 0;
                    iVar163 = 0;
                    iVar155 = 0;
                    iVar112 = -1;
                    while (iVar112 != 2) {
                      iVar133 = iVar89;
                      iVar171 = -1;
                      while (iVar171 != 2) {
                        for (iVar178 = 5; iVar178 != 8; iVar178 = iVar178 + 1) {
                          if (((uVar29 >> (iVar133 + iVar178 & 0x1fU) & 1) != 0) &&
                             ((iVar178 != 6 || iVar171 != 0) || iVar112 != 0)) {
                            iVar155 = iVar155 + (uint)((iVar178 - 5U & 0xfffffffd) == 0 &&
                                                      (iVar171 == 0 && iVar112 == 0));
                            iVar163 = iVar163 + (uint)((iVar178 == 6 && iVar112 == 0) &&
                                                      (iVar171 == 1 || iVar171 + 1 == 0));
                            iVar156 = iVar156 + (uint)((iVar178 == 6 && iVar171 == 0) &&
                                                      (iVar112 == 1 || iVar112 + 1 == 0));
                          }
                        }
                        iVar133 = iVar133 + 3;
                        iVar171 = iVar171 + 1;
                      }
                      iVar89 = iVar89 + 9;
                      iVar112 = iVar112 + 1;
                    }
                    dVar201 = 2.0;
                    if ((uVar29 >> 0x15 & 1) != 0) {
                      cVar125 = '\b';
                      dVar215 = dVar208;
                      dVar201 = dVar208;
                      for (lVar150 = -1; lVar150 != 2; lVar150 = lVar150 + 1) {
                        cVar130 = cVar125;
                        for (lVar93 = 0; lVar93 != 2; lVar93 = lVar93 + 1) {
                          for (lVar120 = 0; lVar120 != 3; lVar120 = lVar120 + 1) {
                            if (((int)lVar120 != 1 || ((int)lVar93 != 0 || (int)lVar150 != 0)) &&
                               ((1 << (cVar130 + (char)lVar120 & 0x1fU) & uVar29) != 0)) {
                              dVar203 = pdVar32[lVar96 + (iVar94 + (int)lVar150) * lVar34 +
                                                         (iVar88 + (int)lVar93) * lVar33 +
                                                         (long)(iVar162 + -1 + (int)lVar120)];
                              dVar205 = dVar203;
                              if (dVar203 <= dVar201) {
                                dVar205 = dVar201;
                              }
                              dVar201 = dVar205;
                              if (dVar203 < dVar215) {
                                dVar215 = dVar203;
                              }
                            }
                          }
                          cVar130 = cVar130 + '\x03';
                        }
                        cVar125 = cVar125 + '\t';
                      }
                      dVar203 = ((local_9c0 - dVar206) * dVar214 +
                                (0.5 - dVar191) * dVar202 +
                                (local_9c8 - dVar199) * dVar200 + dVar208) - dVar208;
                      if (dVar203 <= 1e-13) {
                        dVar201 = 1.0;
                        if ((dVar203 < -1e-13) &&
                           (dVar201 = (dVar215 - dVar208) / dVar203, 1.0 <= dVar201)) {
                          dVar201 = 1.0;
                        }
                      }
                      else {
                        dVar201 = (dVar201 - dVar208) / dVar203;
                        if (1.0 <= dVar201) {
                          dVar201 = 1.0;
                        }
                      }
                      if (2.0 <= dVar201) {
                        dVar201 = 2.0;
                      }
                    }
                    dVar215 = dVar201;
                    if ((short)uVar29 < 0) {
                      cVar125 = '\x05';
                      dVar215 = dVar208;
                      dVar203 = dVar208;
                      for (lVar150 = -1; lVar150 != 2; lVar150 = lVar150 + 1) {
                        cVar130 = cVar125;
                        for (lVar93 = -1; lVar93 != 1; lVar93 = lVar93 + 1) {
                          for (lVar120 = -1; lVar120 != 2; lVar120 = lVar120 + 1) {
                            if ((((int)lVar93 != 0 || (int)lVar150 != 0) || (int)lVar120 != 0) &&
                               ((1 << (cVar130 + (char)lVar120 + 1U & 0x1f) & uVar29) != 0)) {
                              dVar205 = pdVar32[lVar96 + (iVar94 + (int)lVar150) * lVar34 +
                                                         (iVar88 + (int)lVar93) * lVar33 +
                                                         (long)(int)(-uVar10 + iVar161 +
                                                                    (int)lVar120)];
                              dVar195 = dVar205;
                              if (dVar205 <= dVar215) {
                                dVar195 = dVar215;
                              }
                              dVar215 = dVar195;
                              if (dVar205 < dVar203) {
                                dVar203 = dVar205;
                              }
                            }
                          }
                          cVar130 = cVar130 + '\x03';
                        }
                        cVar125 = cVar125 + '\t';
                      }
                      dVar205 = pdVar32[lVar117 + lVar101 + lVar96 + (int)(iVar161 - uVar10)];
                      dVar208 = (((pdVar60 + lVar99 + (lVar2 - iVar22) * lVar61 + local_8b8)[lVar63]
                                 - dVar206) * dVar214 +
                                (((pdVar60[lVar99 + (lVar2 - iVar22) * lVar61 + local_8b8] - dVar199
                                  ) * dVar200 + dVar208) - (dVar191 + 0.5) * dVar202)) - dVar205;
                      if (dVar208 <= 1e-13) {
                        dVar215 = 1.0;
                        if ((dVar208 < -1e-13) &&
                           (dVar215 = (dVar203 - dVar205) / dVar208, 1.0 <= dVar215)) {
                          dVar215 = 1.0;
                        }
                      }
                      else {
                        dVar215 = (dVar215 - dVar205) / dVar208;
                        if (1.0 <= dVar215) {
                          dVar215 = 1.0;
                        }
                      }
                      if (dVar201 <= dVar215) {
                        dVar215 = dVar201;
                      }
                    }
                    dVar201 = dVar215;
                    if ((uVar29 >> 0x13 & 1) != 0) {
                      dVar208 = pdVar32[lVar117 + lVar101 + lVar96 + (int)(iVar161 - uVar10)];
                      cVar125 = '\x06';
                      dVar201 = dVar208;
                      dVar203 = dVar208;
                      for (lVar150 = -1; lVar150 != 2; lVar150 = lVar150 + 1) {
                        cVar130 = cVar125;
                        for (lVar93 = -1; lVar93 != 2; lVar93 = lVar93 + 1) {
                          for (lVar120 = 0; lVar120 != 2; lVar120 = lVar120 + 1) {
                            dVar205 = dVar203;
                            if ((((int)lVar93 != 0 || (int)lVar150 != 0) || (int)lVar120 != 0) &&
                               ((1 << (cVar130 + (char)lVar120 & 0x1fU) & uVar29) != 0)) {
                              dVar205 = pdVar32[lVar96 + (iVar94 + (int)lVar150) * lVar34 +
                                                         (iVar88 + (int)lVar93) * lVar33 +
                                                         (long)(int)(-uVar10 + iVar161 +
                                                                    (int)lVar120)];
                              dVar195 = dVar205;
                              if (dVar205 <= dVar201) {
                                dVar195 = dVar201;
                              }
                              dVar201 = dVar195;
                              if (dVar203 <= dVar205) {
                                dVar205 = dVar203;
                              }
                            }
                            dVar203 = dVar205;
                          }
                          cVar130 = cVar130 + '\x03';
                        }
                        cVar125 = cVar125 + '\t';
                      }
                      dVar205 = (((pdVar56 + lVar105 + lVar118 + ((iVar161 - iVar20) + 1))[lVar59] -
                                 dVar206) * dVar214 +
                                (pdVar56[lVar105 + lVar118 + ((iVar161 - iVar20) + 1)] - dVar191) *
                                dVar202 + (0.5 - dVar199) * dVar200 + dVar208) - dVar208;
                      if (dVar205 <= 1e-13) {
                        dVar201 = 1.0;
                        if (dVar205 < -1e-13) {
                          dVar201 = (dVar203 - dVar208) / dVar205;
                          if (1.0 <= dVar201) {
                            dVar201 = 1.0;
                          }
                        }
                      }
                      else {
                        dVar201 = (dVar201 - dVar208) / dVar205;
                        if (1.0 <= dVar201) {
                          dVar201 = 1.0;
                        }
                      }
                      if (dVar215 <= dVar201) {
                        dVar201 = dVar215;
                      }
                    }
                    dVar208 = dVar201;
                    if ((uVar29 >> 0x11 & 1) != 0) {
                      dVar215 = pdVar32[lVar117 + lVar101 + lVar96 + (int)(iVar161 - uVar10)];
                      cVar125 = '\x05';
                      dVar208 = dVar215;
                      dVar203 = dVar215;
                      for (lVar150 = -1; lVar150 != 2; lVar150 = lVar150 + 1) {
                        cVar130 = cVar125;
                        for (lVar93 = -1; lVar93 != 2; lVar93 = lVar93 + 1) {
                          for (lVar120 = 0; lVar120 != 2; lVar120 = lVar120 + 1) {
                            dVar205 = dVar203;
                            if (((int)lVar120 != 1 || ((int)lVar93 != 0 || (int)lVar150 != 0)) &&
                               ((1 << (cVar130 + (char)lVar120 & 0x1fU) & uVar29) != 0)) {
                              dVar205 = pdVar32[lVar96 + (iVar94 + (int)lVar150) * lVar34 +
                                                         (iVar88 + (int)lVar93) * lVar33 +
                                                         (long)(int)(uVar131 + iVar161 +
                                                                    (int)lVar120)];
                              dVar195 = dVar205;
                              if (dVar205 <= dVar208) {
                                dVar195 = dVar208;
                              }
                              dVar208 = dVar195;
                              if (dVar203 <= dVar205) {
                                dVar205 = dVar203;
                              }
                            }
                            dVar203 = dVar205;
                          }
                          cVar130 = cVar130 + '\x03';
                        }
                        cVar125 = cVar125 + '\t';
                      }
                      dVar205 = (((pdVar56 + lVar105 + lVar118 + (lVar121 - iVar20))[lVar59] -
                                 dVar206) * dVar214 +
                                (pdVar56[lVar105 + lVar118 + (lVar121 - iVar20)] - dVar191) *
                                dVar202 + (dVar215 - (dVar199 + 0.5) * dVar200)) - dVar215;
                      if (dVar205 <= 1e-13) {
                        dVar208 = 1.0;
                        if (dVar205 < -1e-13) {
                          dVar208 = (dVar203 - dVar215) / dVar205;
                          if (1.0 <= dVar208) {
                            dVar208 = 1.0;
                          }
                        }
                      }
                      else {
                        dVar208 = (dVar208 - dVar215) / dVar205;
                        if (1.0 <= dVar208) {
                          dVar208 = 1.0;
                        }
                      }
                      if (dVar201 <= dVar208) {
                        dVar208 = dVar201;
                      }
                    }
                    dVar201 = dVar208;
                    if ((uVar29 >> 0x1b & 1) != 0) {
                      dVar215 = pdVar32[lVar117 + lVar101 + lVar96 + (int)(iVar161 - uVar10)];
                      cVar125 = '\x0e';
                      dVar201 = dVar215;
                      dVar203 = dVar215;
                      for (lVar150 = 0; lVar150 != 2; lVar150 = lVar150 + 1) {
                        cVar130 = cVar125;
                        for (lVar93 = -1; lVar93 != 2; lVar93 = lVar93 + 1) {
                          for (lVar120 = 0; lVar120 != 3; lVar120 = lVar120 + 1) {
                            dVar205 = dVar203;
                            if (((int)lVar120 != 1 || ((int)lVar93 != 0 || (int)lVar150 != 0)) &&
                               ((1 << (cVar130 + (char)lVar120 & 0x1fU) & uVar29) != 0)) {
                              dVar205 = pdVar32[lVar96 + (iVar94 + (int)lVar150) * lVar34 +
                                                         (iVar88 + (int)lVar93) * lVar33 +
                                                         (long)(int)(uVar131 + iVar161 +
                                                                    (int)lVar120)];
                              dVar195 = dVar205;
                              if (dVar205 <= dVar201) {
                                dVar195 = dVar201;
                              }
                              dVar201 = dVar195;
                              if (dVar203 <= dVar205) {
                                dVar205 = dVar203;
                              }
                            }
                            dVar203 = dVar205;
                          }
                          cVar130 = cVar130 + '\x03';
                        }
                        cVar125 = cVar125 + '\t';
                      }
                      dVar205 = ((0.5 - dVar206) * dVar214 +
                                ((pdVar64 + lVar119 + lVar141 + (lVar121 - lVar183))[lVar67] -
                                dVar191) * dVar202 +
                                (pdVar64[lVar119 + lVar141 + (lVar121 - lVar183)] - dVar199) *
                                dVar200 + dVar215) - dVar215;
                      if (dVar205 <= 1e-13) {
                        dVar201 = 1.0;
                        if ((dVar205 < -1e-13) &&
                           (dVar201 = (dVar203 - dVar215) / dVar205, 1.0 <= dVar201)) {
                          dVar201 = 1.0;
                        }
                      }
                      else {
                        dVar201 = (dVar201 - dVar215) / dVar205;
                        if (1.0 <= dVar201) {
                          dVar201 = 1.0;
                        }
                      }
                      if (dVar208 <= dVar201) {
                        dVar201 = dVar208;
                      }
                    }
                    dVar208 = dVar201;
                    if ((uVar29 >> 9 & 1) != 0) {
                      dVar215 = pdVar32[lVar117 + lVar101 + lVar96 + (int)(iVar161 - uVar10)];
                      cVar125 = '\x05';
                      dVar208 = dVar215;
                      dVar203 = dVar215;
                      for (lVar150 = -1; lVar150 != 1; lVar150 = lVar150 + 1) {
                        cVar130 = cVar125;
                        for (lVar93 = -1; lVar93 != 2; lVar93 = lVar93 + 1) {
                          for (lVar120 = 0; lVar120 != 3; lVar120 = lVar120 + 1) {
                            dVar205 = dVar203;
                            if (((int)lVar120 != 1 || ((int)lVar93 != 0 || (int)lVar150 != 0)) &&
                               ((1 << (cVar130 + (char)lVar120 & 0x1fU) & uVar29) != 0)) {
                              dVar205 = pdVar32[lVar96 + (iVar94 + (int)lVar150) * lVar34 +
                                                         (iVar88 + (int)lVar93) * lVar33 +
                                                         (long)(int)(uVar131 + iVar161 +
                                                                    (int)lVar120)];
                              dVar195 = dVar205;
                              if (dVar205 <= dVar208) {
                                dVar195 = dVar208;
                              }
                              dVar208 = dVar195;
                              if (dVar203 <= dVar205) {
                                dVar205 = dVar203;
                              }
                            }
                            dVar203 = dVar205;
                          }
                          cVar130 = cVar130 + '\x03';
                        }
                        cVar125 = cVar125 + '\t';
                      }
                      dVar205 = ((((pdVar64 + lVar119 + lVar142 + (lVar121 - lVar183))[lVar67] -
                                  dVar191) * dVar202 +
                                 (pdVar64[lVar119 + lVar142 + (lVar121 - lVar183)] - dVar199) *
                                 dVar200 + dVar215) - (dVar206 + 0.5) * dVar214) - dVar215;
                      if (dVar205 <= 1e-13) {
                        dVar208 = 1.0;
                        if (dVar205 < -1e-13) {
                          dVar208 = (dVar203 - dVar215) / dVar205;
                          if (1.0 <= dVar208) {
                            dVar208 = 1.0;
                          }
                        }
                      }
                      else {
                        dVar208 = (dVar208 - dVar215) / dVar205;
                        if (1.0 <= dVar208) {
                          dVar208 = 1.0;
                        }
                      }
                      if (dVar201 <= dVar208) {
                        dVar208 = dVar201;
                      }
                    }
                    dVar201 = 0.0;
                    if (1 < iVar155) {
                      dVar201 = dVar208;
                    }
                    dVar215 = 0.0;
                    if (1 < iVar163) {
                      dVar215 = dVar208;
                    }
                    dVar203 = 0.0;
                    if (1 < iVar156) {
                      dVar203 = dVar208;
                    }
                    if ((dVar213 == 1.0) && (!NAN(dVar213))) {
                      if ((pdVar51[lVar113 + lVar128 + (int)(iVar161 + ~uVar17)] == 1.0) &&
                         (((!NAN(pdVar51[lVar113 + lVar128 + (int)(iVar161 + ~uVar17)]) &&
                           (pdVar51[lVar113 + lVar128 + (int)((iVar161 - uVar17) + 1)] == 1.0)) &&
                          (!NAN(pdVar51[lVar113 + lVar128 + (int)((iVar161 - uVar17) + 1)]))))) {
                        dVar201 = 1.0;
                      }
                      dVar215 = (double)(~-(ulong)(dVar192 == 1.0) & (ulong)dVar215 |
                                        (~-(ulong)(pdVar51[lVar128 + lVar149 + lVar168] == 1.0) &
                                         (ulong)dVar215 |
                                        -(ulong)(pdVar51[lVar128 + lVar149 + lVar168] == 1.0) &
                                        0x3ff0000000000000) & -(ulong)(dVar192 == 1.0));
                      if (((pdVar51[lVar113 + lVar168 + lVar106] == 1.0) &&
                          (!NAN(pdVar51[lVar113 + lVar168 + lVar106]))) &&
                         ((pdVar51[lVar113 + lVar168 + lVar107] == 1.0 &&
                          (!NAN(pdVar51[lVar113 + lVar168 + lVar107]))))) {
                        dVar203 = 1.0;
                      }
                    }
                    dVar192 = (local_9c0 - dVar206) * dVar214 * dVar203 +
                              (0.5 - dVar191) * dVar202 * dVar215 +
                              (local_9c8 - dVar199) * dVar200 * dVar201 +
                              pdVar32[lVar117 + lVar101 + lVar96 + (lVar121 - lVar134)];
                    if (dVar192 <= dVar212) {
                      dVar212 = dVar192;
                    }
                    if (dVar204 <= dVar212) {
                      dVar204 = dVar212;
                    }
                    dVar204 = pdVar37[lVar36 + lVar98 + lVar158 + (lVar121 - lVar166)] *
                              dVar189 * -0.5 * dVar202 * dVar215 + dVar204;
                  }
                  else {
                    local_9d8 = pdVar51 + lVar113 + lVar168;
                    if ((local_9d8[lVar128] != 1.0) || (NAN(local_9d8[lVar128]))) goto LAB_003e20db;
                    dVar204 = pdVar51[lVar128 + lVar115 + lVar168];
                    if ((((pdVar51[lVar128 + lVar114 + lVar168] != 1.0) ||
                         (NAN(pdVar51[lVar128 + lVar114 + lVar168]))) || (dVar204 != 1.0)) ||
                       (NAN(dVar204))) {
                      if ((dVar204 != 1.0) || (NAN(dVar204))) goto LAB_003e20db;
LAB_003e3894:
                      lVar93 = lVar121 - lVar134;
                      dVar204 = pdVar32[lVar116 + lVar135 + lVar96 + lVar93];
                      dVar201 = dVar204 - pdVar32[lVar137 + lVar135 + lVar96 + lVar93];
                      dVar208 = pdVar32[lVar187 + lVar135 + lVar96 + lVar93] - dVar204;
                      dVar201 = dVar201 + dVar201;
                      dVar208 = dVar208 + dVar208;
                      dVar191 = (pdVar32[lVar187 + lVar135 + lVar96 + lVar93] -
                                pdVar32[lVar137 + lVar135 + lVar96 + lVar93]) * 0.5;
                      dVar206 = ABS(dVar201);
                      uVar188 = -(ulong)(0.0 < dVar191);
                      dVar191 = ABS(dVar191);
                      dVar199 = ABS(dVar208);
                      if (dVar206 <= dVar191) {
                        dVar191 = dVar206;
                      }
                      if (dVar191 <= dVar199) {
                        dVar199 = dVar191;
                      }
                      uVar196 = -(ulong)(0.0 < dVar201 * dVar208) & (ulong)dVar199;
                      local_9b8 = (double)(~uVar188 & (uVar196 ^ 0x8000000000000000) |
                                          uVar188 & uVar196) *
                                  (-1.0 - pdVar37[lVar36 + lVar98 + lVar136 + (lVar121 - lVar166)] *
                                          dVar189) * 0.5;
                    }
                    else {
                      if ((pdVar51[lVar128 + (lVar4 - lVar180) * lVar52 + lVar168] != 1.0) ||
                         (NAN(pdVar51[lVar128 + (lVar4 - lVar180) * lVar52 + lVar168])))
                      goto LAB_003e3894;
                      lVar93 = lVar121 - lVar134;
                      dVar204 = pdVar32[lVar116 + lVar135 + lVar96 + lVar93];
                      dVar206 = dVar204 - pdVar32[lVar137 + lVar135 + lVar96 + lVar93];
                      dVar201 = pdVar32[lVar137 + lVar135 + lVar96 + lVar93] -
                                pdVar32[lVar138 + lVar135 + lVar96 + lVar93];
                      dVar199 = 0.0;
                      dVar191 = 0.0;
                      if (0.0 <= dVar206 * dVar201) {
                        dVar191 = ABS(dVar206);
                        if (ABS(dVar201) <= ABS(dVar206)) {
                          dVar191 = ABS(dVar201);
                        }
                        dVar191 = dVar191 + dVar191;
                      }
                      dVar200 = pdVar32[lVar96 + lVar135 + (lVar4 - lVar164) * lVar33 + lVar93] -
                                pdVar32[lVar187 + lVar135 + lVar96 + lVar93];
                      dVar202 = pdVar32[lVar187 + lVar135 + lVar96 + lVar93] - dVar204;
                      dVar208 = (dVar202 + dVar200) * 0.5;
                      if (0.0 <= dVar202 * dVar200) {
                        dVar199 = ABS(dVar200);
                        if (ABS(dVar202) <= ABS(dVar200)) {
                          dVar199 = ABS(dVar202);
                        }
                        dVar199 = dVar199 + dVar199;
                      }
                      dVar212 = (dVar206 + dVar202) * 0.5;
                      dVar200 = 0.0;
                      if (0.0 <= dVar206 * dVar202) {
                        dVar200 = ABS(dVar202);
                        if (ABS(dVar206) <= ABS(dVar202)) {
                          dVar200 = ABS(dVar206);
                        }
                        dVar200 = dVar200 + dVar200;
                      }
                      dVar201 = (dVar206 + dVar201) * 0.5;
                      dVar206 = ABS(dVar201);
                      if (dVar191 <= dVar206) {
                        dVar206 = dVar191;
                      }
                      dVar191 = ABS(dVar208);
                      if (dVar199 <= dVar191) {
                        dVar191 = dVar199;
                      }
                      dVar191 = ABS(dVar212 * 1.3333333333333333 +
                                    (dVar191 * (double)((ulong)dVar208 & 0x8000000000000000 |
                                                       0x3ff0000000000000) +
                                    dVar206 * (double)((ulong)dVar201 & 0x8000000000000000 |
                                                      0x3ff0000000000000)) * -0.16666666666666666);
                      if (dVar200 <= dVar191) {
                        dVar191 = dVar200;
                      }
                      local_9b8 = dVar191 * (double)((ulong)dVar212 & 0x8000000000000000 |
                                                    0x3ff0000000000000) *
                                  (-1.0 - pdVar37[lVar36 + lVar98 + lVar136 + (lVar121 - lVar166)] *
                                          dVar189) * 0.5;
                    }
                    local_9b8 = local_9b8 + dVar204;
LAB_003e3986:
                    dVar204 = pdVar51[lVar128 + lVar149 + lVar168];
                    if ((((dVar204 != 1.0) || (NAN(dVar204))) || (dVar192 != 1.0)) ||
                       (((NAN(dVar192) ||
                         (pdVar51[lVar128 + ((iVar126 + -3) - iVar127) * lVar52 + lVar168] != 1.0))
                        || ((NAN(pdVar51[lVar128 + ((iVar126 + -3) - iVar127) * lVar52 + lVar168])
                            || ((pdVar51[lVar128 + lVar148 + lVar168] != 1.0 ||
                                (NAN(pdVar51[lVar128 + lVar148 + lVar168]))))))))) {
                      if ((dVar192 != 1.0) ||
                         (((NAN(dVar192) || (dVar204 != 1.0)) || (NAN(dVar204))))) {
                        iVar162 = iVar161 - uVar10;
                        lVar120 = (long)iVar162;
                        local_8b8 = lVar121 - lVar182;
                        local_9c0 = (pdVar60 + lVar99 + lVar143 + local_8b8)[lVar63];
                        local_9c8 = pdVar60[lVar99 + lVar143 + local_8b8];
                        bVar82 = true;
                        dVar213 = 1.0;
                        goto LAB_003e3d85;
                      }
                      lVar150 = lVar121 - lVar134;
                      dVar204 = pdVar32[lVar137 + lVar135 + lVar96 + lVar150];
                      dVar199 = dVar204 - pdVar32[lVar96 + lVar135 + lVar140 + lVar150];
                      dVar206 = pdVar32[lVar116 + lVar135 + lVar96 + lVar150] - dVar204;
                      dVar199 = dVar199 + dVar199;
                      dVar206 = dVar206 + dVar206;
                      dVar192 = (pdVar32[lVar116 + lVar135 + lVar96 + lVar150] -
                                pdVar32[lVar96 + lVar135 + lVar140 + lVar150]) * 0.5;
                      dVar201 = ABS(dVar199);
                      uVar188 = -(ulong)(0.0 < dVar192);
                      dVar192 = ABS(dVar192);
                      dVar191 = ABS(dVar206);
                      if (dVar201 <= dVar192) {
                        dVar192 = dVar201;
                      }
                      if (dVar192 <= dVar191) {
                        dVar191 = dVar192;
                      }
                      uVar196 = -(ulong)(0.0 < dVar199 * dVar206) & (ulong)dVar191;
                      dVar204 = (double)(~uVar188 & (uVar196 ^ 0x8000000000000000) |
                                        uVar188 & uVar196) *
                                (1.0 - pdVar37[lVar36 + lVar98 + lVar158 + (lVar121 - lVar166)] *
                                       dVar189) * 0.5 + dVar204;
                    }
                    else {
                      lVar150 = lVar121 - lVar134;
                      dVar204 = pdVar32[lVar137 + lVar135 + lVar96 + lVar150];
                      dVar199 = dVar204 - pdVar32[lVar96 + lVar135 + lVar140 + lVar150];
                      dVar206 = pdVar32[lVar96 + lVar135 + lVar140 + lVar150] -
                                pdVar32[lVar96 + lVar135 + ((iVar126 + -3) - iVar172) * lVar33 +
                                                           lVar150];
                      dVar191 = 0.0;
                      dVar192 = 0.0;
                      if (0.0 <= dVar199 * dVar206) {
                        dVar192 = ABS(dVar199);
                        if (ABS(dVar206) <= ABS(dVar199)) {
                          dVar192 = ABS(dVar206);
                        }
                        dVar192 = dVar192 + dVar192;
                      }
                      dVar201 = pdVar32[lVar96 + lVar135 + (iVar185 - iVar172) * lVar33 + lVar150] -
                                pdVar32[lVar116 + lVar135 + lVar96 + lVar150];
                      dVar200 = pdVar32[lVar116 + lVar135 + lVar96 + lVar150] - dVar204;
                      dVar208 = (dVar200 + dVar201) * 0.5;
                      if (0.0 <= dVar200 * dVar201) {
                        dVar191 = ABS(dVar201);
                        if (ABS(dVar200) <= ABS(dVar201)) {
                          dVar191 = ABS(dVar200);
                        }
                        dVar191 = dVar191 + dVar191;
                      }
                      dVar202 = (dVar199 + dVar200) * 0.5;
                      dVar201 = 0.0;
                      if (0.0 <= dVar199 * dVar200) {
                        dVar201 = ABS(dVar200);
                        if (ABS(dVar199) <= ABS(dVar200)) {
                          dVar201 = ABS(dVar199);
                        }
                        dVar201 = dVar201 + dVar201;
                      }
                      dVar206 = (dVar199 + dVar206) * 0.5;
                      dVar199 = ABS(dVar206);
                      if (dVar192 <= dVar199) {
                        dVar199 = dVar192;
                      }
                      dVar192 = ABS(dVar208);
                      if (dVar191 <= dVar192) {
                        dVar192 = dVar191;
                      }
                      dVar192 = ABS(dVar202 * 1.3333333333333333 +
                                    (dVar192 * (double)((ulong)dVar208 & 0x8000000000000000 |
                                                       0x3ff0000000000000) +
                                    dVar199 * (double)((ulong)dVar206 & 0x8000000000000000 |
                                                      0x3ff0000000000000)) * -0.16666666666666666);
                      if (dVar201 <= dVar192) {
                        dVar192 = dVar201;
                      }
                      dVar204 = dVar192 * (double)((ulong)dVar202 & 0x8000000000000000 |
                                                  0x3ff0000000000000) *
                                (1.0 - pdVar37[lVar36 + lVar98 + lVar158 + (lVar121 - lVar166)] *
                                       dVar189) * 0.5 + dVar204;
                    }
                  }
                }
                pdVar44[lVar122 * lVar47 +
                        (lVar92 - iVar14) * lVar46 +
                        (int)(~uVar13 + iVar126) * lVar45 + (lVar121 - iVar12)] = dVar204;
                pdVar40[lVar122 * lVar43 +
                        (lVar92 - iVar11) * lVar42 + lVar129 * lVar41 + (lVar121 - iVar7)] =
                     local_9b8;
                lVar121 = lVar121 + 1;
                pdVar173 = pdVar173 + 1;
                pdVar159 = pdVar159 + 1;
                pdVar151 = pdVar151 + 1;
                iVar81 = iVar81 + 1;
                iVar80 = iVar80 + 1;
                lVar150 = lVar3;
              } while (iVar26 + 1 != (int)lVar121);
            }
          }
          local_878 = local_878 + lVar30;
          local_870 = local_870 + lVar30;
          local_868 = local_868 + lVar30;
          lVar92 = lVar1;
        }
        lVar122 = lVar122 + 1;
      } while( true );
    }
  }
  else {
    iVar8 = (yebox->bigend).vect[0];
  }
  A[0][0] = (Real)q->p;
  A[0][1] = (Real)q->jstride;
  A[0][2] = (Real)q->kstride;
  A[1][0] = (Real)q->nstride;
  A[1][1] = *(Real *)&q->begin;
  uVar68 = *(undefined8 *)&(q->begin).z;
  uVar69 = (q->end).y;
  A[2]._4_8_ = *(undefined8 *)&(q->end).z;
  A[1][2]._0_4_ = (undefined4)uVar68;
  A[1][2]._4_4_ = (undefined4)((ulong)uVar68 >> 0x20);
  A[2][2] = (Real)ccvel->p;
  A[3][0] = (Real)ccvel->jstride;
  A[3][1] = (Real)ccvel->kstride;
  A[3][2] = (Real)ccvel->nstride;
  A[4][0] = *(Real *)&ccvel->begin;
  uVar70 = (ccvel->end).x;
  uVar71 = (ccvel->end).y;
  A._116_8_ = *(undefined8 *)&(ccvel->end).z;
  A[4][1]._0_4_ = (undefined4)*(undefined8 *)&(ccvel->begin).z;
  A[6][1] = (Real)Imy->p;
  A[6][2] = (Real)Imy->jstride;
  A[7][0] = (Real)Imy->kstride;
  A[7][1] = (Real)Imy->nstride;
  A[7][2] = *(Real *)&Imy->begin;
  uVar68 = *(undefined8 *)&(Imy->begin).z;
  uVar72 = (Imy->end).y;
  A[8]._12_8_ = *(undefined8 *)&(Imy->end).z;
  A[8][0]._0_4_ = (undefined4)uVar68;
  A[8][0]._4_4_ = (undefined4)((ulong)uVar68 >> 0x20);
  A[9][0] = (Real)Ipy->p;
  A[9][1] = (Real)Ipy->jstride;
  A[9][2] = (Real)Ipy->kstride;
  A[10][0] = (Real)Ipy->nstride;
  A[10][1] = *(Real *)&Ipy->begin;
  uVar73 = (Ipy->end).x;
  uVar74 = (Ipy->end).y;
  A[0xb]._4_8_ = *(undefined8 *)&(Ipy->end).z;
  A[10][2]._0_4_ = (undefined4)*(undefined8 *)&(Ipy->begin).z;
  A[0xc][0] = (Real)pbc;
  A[0xc][1] = (Real)flag->p;
  A[0xc][2] = (Real)flag->jstride;
  A[0xd][0] = (Real)flag->kstride;
  A[0xd][1] = (Real)flag->nstride;
  A[0xd][2] = *(Real *)&flag->begin;
  uVar68 = *(undefined8 *)&(flag->begin).z;
  uVar75 = (flag->end).y;
  A[0xe]._12_8_ = *(undefined8 *)&(flag->end).z;
  A[0xe][0]._0_4_ = (undefined4)uVar68;
  A[0xe][0]._4_4_ = (undefined4)((ulong)uVar68 >> 0x20);
  A[0xf][0] = (Real)vfrac->p;
  A[0xf][1] = (Real)vfrac->jstride;
  A[0xf][2] = (Real)vfrac->kstride;
  A[0x10][0] = (Real)vfrac->nstride;
  A[0x10][1] = *(Real *)&vfrac->begin;
  uVar68 = *(undefined8 *)&(vfrac->begin).z;
  uVar76 = (vfrac->end).y;
  A[0x11]._4_8_ = *(undefined8 *)&(vfrac->end).z;
  A[0x10][2]._0_4_ = (undefined4)uVar68;
  A[0x10][2]._4_4_ = (undefined4)((ulong)uVar68 >> 0x20);
  A[0x11][2] = (Real)ccc->p;
  A[0x12][0] = (Real)ccc->jstride;
  A[0x12][1] = (Real)ccc->kstride;
  A[0x12][2] = (Real)ccc->nstride;
  A[0x13][0] = *(Real *)&ccc->begin;
  uVar68 = *(undefined8 *)&(ccc->begin).z;
  uVar77 = (ccc->end).y;
  A._476_8_ = *(undefined8 *)&(ccc->end).z;
  A[0x13][1]._0_4_ = (undefined4)uVar68;
  A[0x13][1]._4_4_ = (undefined4)((ulong)uVar68 >> 0x20);
  A[0x14][1] = (Real)fcx->p;
  A[0x14][2] = (Real)fcx->jstride;
  A[0x15][0] = (Real)fcx->kstride;
  A[0x15][1] = (Real)fcx->nstride;
  A[0x15][2] = *(Real *)&fcx->begin;
  uVar68 = *(undefined8 *)&(fcx->begin).z;
  uVar78 = (fcx->end).y;
  A[0x16]._12_8_ = *(undefined8 *)&(fcx->end).z;
  A[0x16][0]._0_4_ = (undefined4)uVar68;
  A[0x16][0]._4_4_ = (undefined4)((ulong)uVar68 >> 0x20);
  A[0x17][0] = (Real)fcy->p;
  A[0x17][1] = (Real)fcy->jstride;
  A[0x17][2] = (Real)fcy->kstride;
  A[0x18][0] = (Real)fcy->nstride;
  A[0x18][1] = *(Real *)&fcy->begin;
  uVar68 = *(undefined8 *)&(fcy->begin).z;
  uVar79 = (fcy->end).y;
  A[0x19]._4_8_ = *(undefined8 *)&(fcy->end).z;
  A[0x18][2]._0_4_ = (undefined4)uVar68;
  A[0x18][2]._4_4_ = (undefined4)((ulong)uVar68 >> 0x20);
  A[0x19][2] = (Real)fcz->p;
  A[0x1a][0] = (Real)fcz->jstride;
  A[0x1a][1] = (Real)fcz->kstride;
  A[0x1a][2] = (Real)fcz->nstride;
  iVar11 = (yebox->smallend).vect[0];
  iVar12 = (yebox->smallend).vect[1];
  iVar14 = (yebox->smallend).vect[2];
  iVar15 = (yebox->bigend).vect[1];
  iVar16 = (yebox->bigend).vect[2];
  A[2][0]._0_4_ = uVar69;
  A[4][1]._4_4_ = uVar70;
  A[4][2]._0_4_ = uVar71;
  A[5][1]._0_4_ = iVar179;
  A[5][1]._4_4_ = iVar186;
  A[5][2]._0_4_ = iVar6;
  A[5][2]._4_4_ = iVar172;
  A[6][0]._0_4_ = iVar5;
  A[6][0]._4_4_ = iVar7;
  A[8][1]._0_4_ = uVar72;
  A[10][2]._4_4_ = uVar73;
  A[0xb][0]._0_4_ = uVar74;
  A[0xb][2] = dVar189;
  A[0xe][1]._0_4_ = uVar75;
  A[0x11][0]._0_4_ = uVar76;
  A[0x13][2]._0_4_ = uVar77;
  A[0x16][1]._0_4_ = uVar78;
  A[0x19][0]._0_4_ = uVar79;
  for (iVar127 = 0; iVar179 = iVar14, iVar127 != 3; iVar127 = iVar127 + 1) {
    for (; iVar186 = iVar12, iVar179 <= iVar16; iVar179 = iVar179 + 1) {
      for (; iVar186 <= iVar15; iVar186 = iVar186 + 1) {
        iVar172 = iVar11;
        if (iVar11 <= iVar8) {
          do {
            PredictVelOnYFace::anon_class_680_18_513cbdb0::operator()
                      ((anon_class_680_18_513cbdb0 *)A,iVar172,iVar186,iVar179,iVar127);
            iVar172 = iVar172 + 1;
          } while (iVar8 + 1 != iVar172);
        }
      }
    }
  }
  return;
}

Assistant:

void
EBPLM::PredictVelOnYFace (Box const& yebox,
                          Array4<Real> const& Imy, Array4<Real> const& Ipy,
                          Array4<Real const> const& q,
                          Array4<Real const> const& ccvel,
                          Array4<EBCellFlag const> const& flag,
                          Array4<Real const> const& vfrac,
                          AMREX_D_DECL(Array4<Real const> const& fcx,
                                       Array4<Real const> const& fcy,
                                       Array4<Real const> const& fcz),
                          Array4<Real const> const& ccc,
                          Geometry& geom,
                          Real dt,
                          Vector<BCRec> const& h_bcrec,
                          BCRec const* pbc)
{
    const Real dy = geom.CellSize(1);
    const Real dtdy = dt/dy;
    int ncomp = AMREX_SPACEDIM;

    const Box& domain_box = geom.Domain();
    const int domain_ilo = domain_box.smallEnd(0);
    const int domain_ihi = domain_box.bigEnd(0);
    const int domain_jlo = domain_box.smallEnd(1);
    const int domain_jhi = domain_box.bigEnd(1);

    // At an ext_dir boundary, the boundary value is on the face, not cell center.
    auto extdir_lohi_x = has_extdir_or_ho(h_bcrec.data(), AMREX_SPACEDIM, static_cast<int>(Direction::x));
    auto extdir_lohi_y = has_extdir_or_ho(h_bcrec.data(), AMREX_SPACEDIM, static_cast<int>(Direction::y));

    bool has_extdir_or_ho_lo_x = extdir_lohi_x.first;
    bool has_extdir_or_ho_hi_x = extdir_lohi_x.second;
    bool has_extdir_or_ho_lo_y = extdir_lohi_y.first;
    bool has_extdir_or_ho_hi_y = extdir_lohi_y.second;

#if (AMREX_SPACEDIM == 3)
    const int domain_klo = domain_box.smallEnd(2);
    const int domain_khi = domain_box.bigEnd(2);
    auto extdir_lohi_z = has_extdir_or_ho(h_bcrec.data(), AMREX_SPACEDIM, static_cast<int>(Direction::z));
    bool has_extdir_or_ho_lo_z = extdir_lohi_z.first;
    bool has_extdir_or_ho_hi_z = extdir_lohi_z.second;
#endif

    if ( (has_extdir_or_ho_lo_x && domain_ilo >= yebox.smallEnd(0)-1) ||
         (has_extdir_or_ho_hi_x && domain_ihi <= yebox.bigEnd(0)    ) ||
#if (AMREX_SPACEDIM == 3)
         (has_extdir_or_ho_lo_z && domain_klo >= yebox.smallEnd(2)-1) ||
         (has_extdir_or_ho_hi_z && domain_khi <= yebox.bigEnd(2)    ) ||
#endif
         (has_extdir_or_ho_lo_y && domain_jlo >= yebox.smallEnd(1)-1) ||
         (has_extdir_or_ho_hi_y && domain_jhi <= yebox.bigEnd(1)    ) )
    {
        amrex::ParallelFor(yebox, ncomp, [q,ccvel,AMREX_D_DECL(domain_ilo,domain_jlo,domain_klo),
                                                  AMREX_D_DECL(domain_ihi,domain_jhi,domain_khi),
                                          Imy,Ipy,dtdy,pbc,flag,vfrac,ccc,AMREX_D_DECL(fcx,fcy,fcz)]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            Real qpls(0.);
            Real qmns(0.);

            // This means apy(i,j,k) > 0 and we have un-covered cells on both sides
            if (flag(i,j,k).isConnected(0,-1,0))
            {
                const auto& bc = pbc[n];
                bool extdir_or_ho_ilo = (bc.lo(0) == BCType::ext_dir) ||
                                        (bc.lo(0) == BCType::hoextrap);
                bool extdir_or_ho_ihi = (bc.hi(0) == BCType::ext_dir) ||
                                        (bc.hi(0) == BCType::hoextrap);
                bool extdir_or_ho_jlo = (bc.lo(1) == BCType::ext_dir) ||
                                        (bc.lo(1) == BCType::hoextrap);
                bool extdir_or_ho_jhi = (bc.hi(1) == BCType::ext_dir) ||
                                        (bc.hi(1) == BCType::hoextrap);
#if (AMREX_SPACEDIM == 3)
                bool extdir_or_ho_klo = (bc.lo(2) == BCType::ext_dir) ||
                                        (bc.lo(2) == BCType::hoextrap);
                bool extdir_or_ho_khi = (bc.hi(2) == BCType::ext_dir) ||
                                        (bc.hi(2) == BCType::hoextrap);
#endif

                // *************************************************
                // Making qpls
                // *************************************************

                // We have enough cells to do 4th order slopes centered on (i,j,k) with all values at cell centers
                if (vfrac(i,j,k) == 1. && vfrac(i,j-1,k) == 1. && vfrac(i,j-2,k) == 1. &&
                                           vfrac(i,j+1,k) == 1. && vfrac(i,j+2,k) == 1.)
                {
                    int order = 4;
                    qpls = q(i,j  ,k,n) + 0.5 * (-1.0 - ccvel(i  ,j,k,1) * dtdy) *
                        amrex_calc_yslope_extdir(i,j,k,n,order,q,extdir_or_ho_jlo,extdir_or_ho_jhi,domain_jlo,domain_jhi);

                // We have enough cells to do 2nd order slopes with all values at cell centers
                } else if (vfrac(i,j,k) == 1. && vfrac(i,j-1,k) == 1. && vfrac(i,j+1,k) == 1.) {

                    int order = 2;
                    qpls = q(i,j  ,k,n) + 0.5 * (-1.0 - ccvel(i  ,j,k,1) * dtdy) *
                        amrex_calc_yslope_extdir(i,j,k,n,order,q,extdir_or_ho_jlo,extdir_or_ho_jhi,domain_jlo,domain_jhi);

                // We need to use LS slopes
                } else {

                    Real xf = fcy(i,j,k,0); // local (x,z) of centroid of y-face we are extrapolating to
#if (AMREX_SPACEDIM == 3)
                    Real zf = fcy(i,j,k,1);
#endif
                    AMREX_D_TERM(Real delta_y = -0.5 - ccc(i,j,k,1);,
                                 Real delta_x =  xf  - ccc(i,j,k,0);,
                                 Real delta_z =  zf  - ccc(i,j,k,2););

                    Real qcc_max = amrex::max(q(i,j,k,n), q(i,j-1,k,n));
                    Real qcc_min = amrex::min(q(i,j,k,n), q(i,j-1,k,n));

                    // This will be used in the EB slope routine only if the slope can be computed without LS
                    int max_order = 2;

                    const auto& slopes_eb_hi = amrex_lim_slopes_extdir_eb(i,j,k,n,q,ccc,vfrac,
                                               AMREX_D_DECL(fcx,fcy,fcz), flag,
                                               AMREX_D_DECL(extdir_or_ho_ilo, extdir_or_ho_jlo, extdir_or_ho_klo),
                                               AMREX_D_DECL(extdir_or_ho_ihi, extdir_or_ho_jhi, extdir_or_ho_khi),
                                               AMREX_D_DECL(domain_ilo, domain_jlo, domain_klo),
                                               AMREX_D_DECL(domain_ihi, domain_jhi, domain_khi),
                                               max_order);

#if (AMREX_SPACEDIM == 3)
                   qpls = q(i,j,k,n) + delta_y * slopes_eb_hi[1]
                                     + delta_x * slopes_eb_hi[0]
                                     + delta_z * slopes_eb_hi[2];
#else
                   qpls = q(i,j,k,n) + delta_y * slopes_eb_hi[1]
                                     + delta_x * slopes_eb_hi[0];
#endif
                   qpls = amrex::max(amrex::min(qpls, qcc_max), qcc_min);

                   qpls -= 0.5 * dtdy * ccvel(i,j,k,1) * slopes_eb_hi[1];

                }  // end of making qpls

                // *************************************************
                // Making qmns
                // *************************************************

                // We have enough cells to do 4th order slopes centered on (i,j-1,k) with all values at cell centers
                if (vfrac(i,j-1,k) == 1. && vfrac(i,j-2,k) == 1. && vfrac(i,j-3,k) == 1. &&
                                             vfrac(i,j  ,k) == 1. && vfrac(i,j+1,k) == 1.)
                {
                    int order = 4;
                    qmns = q(i,j-1,k,n) + 0.5 * ( 1.0 - ccvel(i,j-1,k,1) * dtdy) *
                        amrex_calc_yslope_extdir(i,j-1,k,n,order,q,extdir_or_ho_jlo,extdir_or_ho_jhi,domain_jlo,domain_jhi);

                // We have enough cells to do 2nd order slopes with all values at cell centers
                } else if (vfrac(i,j-1,k) == 1. && vfrac(i,j-2,k) == 1. && vfrac(i,j  ,k) == 1.)
                {
                    int order = 2;
                    qmns = q(i,j-1,k,n) + 0.5 * ( 1.0 - ccvel(i,j-1,k,1) * dtdy) *
                        amrex_calc_yslope_extdir(i,j-1,k,n,order,q,extdir_or_ho_jlo,extdir_or_ho_jhi,domain_jlo,domain_jhi);

                // We need to use LS slopes
                } else {

                    Real xf = fcy(i,j,k,0); // local (x,z) of centroid of y-face we are extrapolating to
#if (AMREX_SPACEDIM == 3)
                    Real zf = fcy(i,j,k,1);
#endif
                    AMREX_D_TERM(Real delta_y = 0.5 - ccc(i,j-1,k,1);,
                                 Real delta_x = xf  - ccc(i,j-1,k,0);,
                                 Real delta_z = zf  - ccc(i,j-1,k,2););

                    Real qcc_max = amrex::max(q(i,j,k,n), q(i,j-1,k,n));
                    Real qcc_min = amrex::min(q(i,j,k,n), q(i,j-1,k,n));

                    // This will be used in the EB slope routine only if the slope can be computed without LS
                    int max_order = 2;

                    const auto& slopes_eb_lo = amrex_lim_slopes_extdir_eb(i,j-1,k,n,q,ccc,vfrac,
                                               AMREX_D_DECL(fcx,fcy,fcz), flag,
                                               AMREX_D_DECL(extdir_or_ho_ilo, extdir_or_ho_jlo, extdir_or_ho_klo),
                                               AMREX_D_DECL(extdir_or_ho_ihi, extdir_or_ho_jhi, extdir_or_ho_khi),
                                               AMREX_D_DECL(domain_ilo, domain_jlo, domain_klo),
                                               AMREX_D_DECL(domain_ihi, domain_jhi, domain_khi),
                                               max_order);


#if (AMREX_SPACEDIM == 3)
                   qmns = q(i,j-1,k,n) + delta_x * slopes_eb_lo[0]
                                       + delta_y * slopes_eb_lo[1]
                                       + delta_z * slopes_eb_lo[2];
#else
                   qmns = q(i,j-1,k,n) + delta_x * slopes_eb_lo[0]
                                       + delta_y * slopes_eb_lo[1];
#endif
                   qmns = amrex::max(amrex::min(qmns, qcc_max), qcc_min);

                   qmns -= 0.5 * dtdy * ccvel(i,j-1,k,1) * slopes_eb_lo[1];

                }  // end of making qmns
            }

            Ipy(i,j-1,k,n) = qmns;
            Imy(i,j  ,k,n) = qpls;
        });
    }
    else // The cases below are not near any domain boundary
    {
        amrex::ParallelFor(yebox, ncomp, [q,ccvel,AMREX_D_DECL(domain_ilo,domain_jlo,domain_klo),
                                          AMREX_D_DECL(domain_ihi,domain_jhi,domain_khi),
                                          Imy,Ipy,dtdy,pbc,flag,vfrac,ccc,AMREX_D_DECL(fcx,fcy,fcz)]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            Real qpls(0.);
            Real qmns(0.);

            // This means apx(i,j,k) > 0 and we have un-covered cells on both sides
            if (flag(i,j,k).isConnected(0,-1,0))
            {
                // *************************************************
                // Making qpls
                // *************************************************

                // We have enough cells to do 4th order slopes centered on (i,j,k) with all values at cell centers
                if (vfrac(i,j,k) == 1. && vfrac(i,j-1,k) == 1. && vfrac(i,j-2,k) == 1. &&
                                           vfrac(i,j+1,k) == 1. && vfrac(i,j+2,k) == 1.)
                {
                    int order = 4;
                    qpls = q(i,j,k,n) + 0.5 * (-1.0 - ccvel(i,j,k,1) * dtdy) *
                        amrex_calc_yslope(i,j,k,n,order,q);

                // We have enough cells to do 2nd order slopes with all values at cell centers
                } else if (vfrac(i,j,k) == 1. && vfrac(i,j-1,k) == 1. && vfrac(i,j+1,k) == 1.) {

                    int order = 2;
                    qpls = q(i,j,k,n) + 0.5 * (-1.0 - ccvel(i,j,k,1) * dtdy) *
                        amrex_calc_yslope(i,j,k,n,order,q);

                // We need to use LS slopes
                } else {

                   Real xf = fcy(i,j,k,0); // local (x,z) of centroid of y-face we are extrapolating to
#if (AMREX_SPACEDIM == 3)
                   Real zf = fcy(i,j,k,1);
#endif
                   AMREX_D_TERM(Real delta_y = -0.5 - ccc(i,j,k,1);,
                                Real delta_x =  xf  - ccc(i,j,k,0);,
                                Real delta_z =  zf  - ccc(i,j,k,2););

                   Real qcc_max = amrex::max(q(i,j,k,n), q(i,j-1,k,n));
                   Real qcc_min = amrex::min(q(i,j,k,n), q(i,j-1,k,n));

                   // This will be used in the EB slope routine only if the slope can be computed without LS
                   int max_order = 2;

                   const auto& slopes_eb_hi = amrex_lim_slopes_eb(i,j,k,n,q,ccc,vfrac,
                                                                  AMREX_D_DECL(fcx,fcy,fcz),flag,max_order);

#if (AMREX_SPACEDIM == 3)
                   qpls = q(i,j,k,n) + delta_y * slopes_eb_hi[1]
                                     + delta_x * slopes_eb_hi[0]
                                     + delta_z * slopes_eb_hi[2];
#else
                   qpls = q(i,j,k,n) + delta_y * slopes_eb_hi[1]
                                     + delta_x * slopes_eb_hi[0];
#endif
                   qpls = amrex::max(amrex::min(qpls, qcc_max), qcc_min);

                   qpls -= 0.5 * dtdy * ccvel(i,j,k,1) * slopes_eb_hi[1];

                }  // end of making qpls

                // *************************************************
                // Making qmns
                // *************************************************

                // We have enough cells to do 4th order slopes centered on (i,j-1,k) with all values at cell centers
                if (vfrac(i,j-1,k) == 1. && vfrac(i,j-2,k) == 1. && vfrac(i,j-3,k) == 1. &&
                                             vfrac(i,j  ,k) == 1. && vfrac(i,j+1,k) == 1.)
                {
                    int order = 4;
                    qmns = q(i,j-1,k,n) + 0.5 * ( 1.0 - ccvel(i,j-1,k,1) * dtdy) *
                        amrex_calc_yslope(i,j-1,k,n,order,q);

                // We have enough cells to do 2nd order slopes with all values at cell centers
                } else if (vfrac(i,j-1,k) == 1. && vfrac(i,j-2,k) == 1. && vfrac(i,j  ,k) == 1.)
                {
                    int order = 2;
                    qmns = q(i,j-1,k,n) + 0.5 * ( 1.0 - ccvel(i,j-1,k,1) * dtdy) *
                        amrex_calc_yslope(i,j-1,k,n,order,q);

                // We need to use LS slopes
                } else {

                   Real xf = fcy(i,j,k,0); // local (x,z) of centroid of y-face we are extrapolating to
#if (AMREX_SPACEDIM == 3)
                   Real zf = fcy(i,j,k,1);
#endif
                   AMREX_D_TERM(Real delta_y = 0.5 - ccc(i,j-1,k,1);,
                                Real delta_x = xf  - ccc(i,j-1,k,0);,
                                Real delta_z = zf  - ccc(i,j-1,k,2););

                   Real qcc_max = amrex::max(q(i,j,k,n), q(i,j-1,k,n));
                   Real qcc_min = amrex::min(q(i,j,k,n), q(i,j-1,k,n));

                   // This will be used in the EB slope routine only if the slope can be computed without LS
                   int max_order = 2;

                   const auto& slopes_eb_lo = amrex_lim_slopes_eb(i,j-1,k,n,q,ccc,vfrac,
                                                                  AMREX_D_DECL(fcx,fcy,fcz),flag,max_order);

#if (AMREX_SPACEDIM == 3)
                   qmns = q(i,j-1,k,n) + delta_x * slopes_eb_lo[0]
                                       + delta_y * slopes_eb_lo[1]
                                       + delta_z * slopes_eb_lo[2];
#else
                   qmns = q(i,j-1,k,n) + delta_x * slopes_eb_lo[0]
                                       + delta_y * slopes_eb_lo[1];
#endif
                   qmns = amrex::max(amrex::min(qmns, qcc_max), qcc_min);

                   qmns -= 0.5 * dtdy * ccvel(i,j-1,k,1) * slopes_eb_lo[1];

                }  // end of making qmns
            }

            Ipy(i,j-1,k,n) = qmns;
            Imy(i,j  ,k,n) = qpls;
        });
    }
}